

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  uint uVar8;
  size_t sVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [16];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  unkbyte10 Var26;
  undefined1 auVar27 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  uint uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  long lVar32;
  size_t sVar33;
  long lVar34;
  Scene *pSVar35;
  RTCRayN *pRVar36;
  RTCFilterFunctionN p_Var37;
  int iVar38;
  ulong uVar39;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  int iVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  uint uVar129;
  uint uVar145;
  uint uVar146;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar147;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  float fVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar155;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar156;
  float fVar157;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar167;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar176;
  float fVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar179;
  float fVar180;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar188;
  float fVar192;
  float fVar193;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  byte bVar194;
  char cVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  byte bVar213;
  char cVar214;
  byte bVar215;
  char cVar216;
  char cVar217;
  char cVar218;
  float fVar219;
  char cVar221;
  char cVar222;
  byte bVar224;
  float fVar225;
  undefined1 auVar202 [16];
  undefined1 auVar209 [16];
  float fVar220;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar212 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar258;
  undefined1 auVar257 [16];
  UVIdentity<4> mapUV;
  undefined8 local_14a8;
  float fStack_14a0;
  float fStack_149c;
  float fStack_148c;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  vbool<4> valid;
  undefined1 local_1418 [16];
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  RTCFilterFunctionNArguments args;
  ulong local_1380;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float fStack_1350;
  float fStack_134c;
  vint<4> sy;
  vfloat<4> tNear;
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [8];
  float fStack_12a0;
  float fStack_129c;
  float local_1298 [4];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [16];
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  ulong local_1220;
  ulong local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  ulong local_11f8;
  long local_11f0;
  long local_11e8;
  ulong local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  long local_11b8;
  ulong local_11b0;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  vint<4> sx;
  undefined4 local_1148;
  undefined4 uStack_1144;
  undefined4 uStack_1140;
  undefined4 uStack_113c;
  undefined1 local_1138 [8];
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  undefined4 local_1118;
  undefined4 uStack_1114;
  undefined4 uStack_1110;
  undefined4 uStack_110c;
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  uint local_10d8;
  uint uStack_10d4;
  uint uStack_10d0;
  uint uStack_10cc;
  uint local_10c8;
  uint uStack_10c4;
  uint uStack_10c0;
  uint uStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined8 local_1038;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar203 [16];
  undefined1 auVar199 [11];
  undefined1 auVar204 [16];
  undefined1 auVar210 [16];
  undefined1 auVar200 [12];
  undefined1 auVar205 [16];
  undefined1 auVar201 [13];
  undefined1 auVar206 [16];
  undefined1 auVar211 [16];
  undefined1 auVar208 [16];
  undefined1 auVar207 [16];
  undefined2 uVar223;
  
  pSVar40 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar30 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  fVar106 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar198 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar111._4_4_ = uVar30;
  auVar111._0_4_ = uVar30;
  auVar111._8_4_ = uVar30;
  auVar111._12_4_ = uVar30;
  fVar156 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar234 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar243 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar179 = fVar156 * 0.99999964;
  fVar187 = fVar234 * 0.99999964;
  fVar254 = fVar243 * 0.99999964;
  fVar156 = fVar156 * 1.0000004;
  fVar234 = fVar234 * 1.0000004;
  fVar243 = fVar243 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = uVar41 ^ 0x10;
  uVar47 = uVar43 ^ 0x10;
  iVar38 = (tray->tnear).field_0.i[k];
  auVar68._4_4_ = iVar38;
  auVar68._0_4_ = iVar38;
  auVar68._8_4_ = iVar38;
  auVar68._12_4_ = iVar38;
  iVar38 = (tray->tfar).field_0.i[k];
  auVar88._4_4_ = iVar38;
  auVar88._0_4_ = iVar38;
  auVar88._8_4_ = iVar38;
  auVar88._12_4_ = iVar38;
  local_11f8 = uVar41 >> 2;
  local_1200 = uVar46 >> 2;
  local_1208 = uVar43 >> 2;
  local_1210 = uVar47 >> 2;
  local_1218 = uVar45 >> 2;
  lVar32 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_11b0 = uVar45 ^ 0x10;
  local_1220 = (uVar45 ^ 0x10) >> 2;
  local_11c0 = uVar41;
  local_11c8 = uVar43;
  local_11d0 = uVar45;
  local_11d8 = uVar46;
  local_1278 = auVar68;
  local_10a8 = auVar111;
  local_1188 = fVar106;
  fStack_1184 = fVar106;
  fStack_1180 = fVar106;
  fStack_117c = fVar106;
  local_1068 = fVar198;
  fStack_1064 = fVar198;
  fStack_1060 = fVar198;
  fStack_105c = fVar198;
  local_1198 = fVar156;
  fStack_1194 = fVar156;
  fStack_1190 = fVar156;
  fStack_118c = fVar156;
  local_1078 = fVar234;
  fStack_1074 = fVar234;
  fStack_1070 = fVar234;
  fStack_106c = fVar234;
  local_1088 = fVar243;
  fStack_1084 = fVar243;
  fStack_1080 = fVar243;
  fStack_107c = fVar243;
  local_1098 = fVar254;
  fStack_1094 = fVar254;
  fStack_1090 = fVar254;
  fStack_108c = fVar254;
  local_11a8 = fVar179;
  fStack_11a4 = fVar179;
  fStack_11a0 = fVar179;
  fStack_119c = fVar179;
  local_10b8 = fVar187;
  fStack_10b4 = fVar187;
  fStack_10b0 = fVar187;
  fStack_10ac = fVar187;
  local_11e0 = uVar47;
  fVar229 = fVar234;
  fVar255 = fVar234;
  fVar244 = fVar234;
  fVar180 = fVar156;
  fVar168 = fVar156;
  fVar166 = fVar156;
  fVar176 = fVar187;
  fVar230 = fVar187;
  fVar178 = fVar187;
  fVar177 = fVar106;
  fVar247 = fVar106;
  fVar250 = fVar106;
  fVar252 = fVar179;
  fVar185 = fVar179;
  fVar186 = fVar179;
  fVar153 = fVar198;
  fVar154 = fVar198;
  fVar155 = fVar198;
  fVar157 = fVar243;
  fVar164 = fVar243;
  fVar165 = fVar243;
  fVar167 = fVar254;
  fVar188 = fVar254;
  fVar192 = fVar254;
LAB_00675d7c:
  local_1288 = auVar88;
  do {
    do {
      if (pSVar40 == stack) {
        return;
      }
      pSVar28 = pSVar40 + -1;
      pSVar40 = pSVar40 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar28->dist &&
             (float)pSVar28->dist != *(float *)(ray + k * 4 + 0x80));
    sVar33 = (pSVar40->ptr).ptr;
    while( true ) {
      if ((sVar33 & 8) != 0) {
        local_11f0 = (ulong)((uint)sVar33 & 0xf) - 8;
        uVar48 = sVar33 & 0xfffffffffffffff0;
        local_11e8 = 0;
        goto LAB_00676108;
      }
      pfVar5 = (float *)(sVar33 + 0x20 + uVar41);
      auVar63._0_4_ = (*pfVar5 - auVar111._0_4_) * fVar179;
      auVar63._4_4_ = (pfVar5[1] - auVar111._4_4_) * fVar252;
      auVar63._8_4_ = (pfVar5[2] - auVar111._8_4_) * fVar185;
      auVar63._12_4_ = (pfVar5[3] - auVar111._12_4_) * fVar186;
      pfVar5 = (float *)(sVar33 + 0x20 + uVar43);
      auVar83._0_4_ = (*pfVar5 - fVar106) * fVar187;
      auVar83._4_4_ = (pfVar5[1] - fVar177) * fVar176;
      auVar83._8_4_ = (pfVar5[2] - fVar247) * fVar230;
      auVar83._12_4_ = (pfVar5[3] - fVar250) * fVar178;
      auVar64 = maxps(auVar63,auVar83);
      pfVar5 = (float *)(sVar33 + 0x20 + uVar45);
      auVar84._0_4_ = (*pfVar5 - fVar198) * fVar254;
      auVar84._4_4_ = (pfVar5[1] - fVar153) * fVar167;
      auVar84._8_4_ = (pfVar5[2] - fVar154) * fVar188;
      auVar84._12_4_ = (pfVar5[3] - fVar155) * fVar192;
      pfVar5 = (float *)(sVar33 + 0x20 + uVar46);
      auVar107._0_4_ = (*pfVar5 - auVar111._0_4_) * fVar156;
      auVar107._4_4_ = (pfVar5[1] - auVar111._4_4_) * fVar180;
      auVar107._8_4_ = (pfVar5[2] - auVar111._8_4_) * fVar168;
      auVar107._12_4_ = (pfVar5[3] - auVar111._12_4_) * fVar166;
      pfVar5 = (float *)(sVar33 + 0x20 + uVar47);
      auVar130._0_4_ = (*pfVar5 - fVar106) * fVar234;
      auVar130._4_4_ = (pfVar5[1] - fVar177) * fVar229;
      auVar130._8_4_ = (pfVar5[2] - fVar247) * fVar255;
      auVar130._12_4_ = (pfVar5[3] - fVar250) * fVar244;
      auVar108 = minps(auVar107,auVar130);
      pfVar5 = (float *)(sVar33 + 0x20 + local_11b0);
      auVar131._0_4_ = (*pfVar5 - fVar198) * fVar243;
      auVar131._4_4_ = (pfVar5[1] - fVar153) * fVar157;
      auVar131._8_4_ = (pfVar5[2] - fVar154) * fVar164;
      auVar131._12_4_ = (pfVar5[3] - fVar155) * fVar165;
      auVar85 = maxps(auVar84,auVar68);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar64,auVar85);
      auVar64 = minps(auVar131,auVar88);
      auVar64 = minps(auVar108,auVar64);
      auVar65._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar64._4_4_);
      auVar65._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar64._0_4_);
      auVar65._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar64._8_4_);
      auVar65._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar64._12_4_);
      uVar29 = movmskps((int)local_11b0,auVar65);
      if (uVar29 == 0) break;
      uVar29 = uVar29 & 0xff;
      uVar48 = sVar33 & 0xfffffffffffffff0;
      lVar34 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
        }
      }
      sVar33 = *(size_t *)(uVar48 + lVar34 * 8);
      uVar29 = uVar29 - 1 & uVar29;
      if (uVar29 != 0) {
        uVar8 = tNear.field_0.i[lVar34];
        lVar34 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        sVar9 = *(size_t *)(uVar48 + lVar34 * 8);
        uVar129 = tNear.field_0.i[lVar34];
        uVar29 = uVar29 - 1 & uVar29;
        if (uVar29 == 0) {
          if (uVar8 < uVar129) {
            (pSVar40->ptr).ptr = sVar9;
            pSVar40->dist = uVar129;
            pSVar40 = pSVar40 + 1;
          }
          else {
            (pSVar40->ptr).ptr = sVar33;
            pSVar40->dist = uVar8;
            pSVar40 = pSVar40 + 1;
            sVar33 = sVar9;
          }
        }
        else {
          auVar66._8_4_ = uVar8;
          auVar66._0_8_ = sVar33;
          auVar66._12_4_ = 0;
          auVar86._8_4_ = uVar129;
          auVar86._0_8_ = sVar9;
          auVar86._12_4_ = 0;
          lVar34 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar39 = *(ulong *)(uVar48 + lVar34 * 8);
          iVar38 = tNear.field_0.i[lVar34];
          auVar109._8_4_ = iVar38;
          auVar109._0_8_ = uVar39;
          auVar109._12_4_ = 0;
          auVar132._8_4_ = -(uint)((int)uVar8 < (int)uVar129);
          uVar29 = uVar29 - 1 & uVar29;
          auVar88 = local_1288;
          if (uVar29 == 0) {
            auVar132._4_4_ = auVar132._8_4_;
            auVar132._0_4_ = auVar132._8_4_;
            auVar132._12_4_ = auVar132._8_4_;
            auVar64 = auVar66 & auVar132 | ~auVar132 & auVar86;
            auVar85 = auVar86 & auVar132 | ~auVar132 & auVar66;
            auVar133._8_4_ = -(uint)(auVar64._8_4_ < iVar38);
            auVar133._0_8_ = CONCAT44(auVar133._8_4_,auVar133._8_4_);
            auVar133._12_4_ = auVar133._8_4_;
            sVar33 = ~auVar133._0_8_ & uVar39 | auVar64._0_8_ & auVar133._0_8_;
            auVar64 = auVar109 & auVar133 | ~auVar133 & auVar64;
            auVar67._8_4_ = -(uint)(auVar85._8_4_ < auVar64._8_4_);
            auVar67._4_4_ = auVar67._8_4_;
            auVar67._0_4_ = auVar67._8_4_;
            auVar67._12_4_ = auVar67._8_4_;
            *pSVar40 = (StackItemT<embree::NodeRefPtr<4>_>)(~auVar67 & auVar85 | auVar64 & auVar67);
            pSVar40[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar85 & auVar67 | ~auVar67 & auVar64);
            pSVar40 = pSVar40 + 2;
          }
          else {
            lVar34 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            iVar54 = tNear.field_0.i[lVar34];
            auVar148._8_4_ = iVar54;
            auVar148._0_8_ = *(undefined8 *)(uVar48 + lVar34 * 8);
            auVar148._12_4_ = 0;
            auVar134._4_4_ = auVar132._8_4_;
            auVar134._0_4_ = auVar132._8_4_;
            auVar134._8_4_ = auVar132._8_4_;
            auVar134._12_4_ = auVar132._8_4_;
            auVar68 = auVar66 & auVar134 | ~auVar134 & auVar86;
            auVar64 = auVar86 & auVar134 | ~auVar134 & auVar66;
            auVar158._0_4_ = -(uint)(iVar38 < iVar54);
            auVar158._4_4_ = -(uint)(iVar38 < iVar54);
            auVar158._8_4_ = -(uint)(iVar38 < iVar54);
            auVar158._12_4_ = -(uint)(iVar38 < iVar54);
            auVar85 = auVar109 & auVar158 | ~auVar158 & auVar148;
            auVar159 = ~auVar158 & auVar109 | auVar148 & auVar158;
            auVar110._8_4_ = -(uint)(auVar64._8_4_ < auVar159._8_4_);
            auVar110._4_4_ = auVar110._8_4_;
            auVar110._0_4_ = auVar110._8_4_;
            auVar110._12_4_ = auVar110._8_4_;
            auVar108 = auVar64 & auVar110 | ~auVar110 & auVar159;
            auVar87._8_4_ = -(uint)(auVar68._8_4_ < auVar85._8_4_);
            auVar87._0_8_ = CONCAT44(auVar87._8_4_,auVar87._8_4_);
            auVar87._12_4_ = auVar87._8_4_;
            sVar33 = auVar68._0_8_ & auVar87._0_8_ | ~auVar87._0_8_ & auVar85._0_8_;
            auVar68 = ~auVar87 & auVar68 | auVar85 & auVar87;
            auVar69._8_4_ = -(uint)(auVar68._8_4_ < auVar108._8_4_);
            auVar69._4_4_ = auVar69._8_4_;
            auVar69._0_4_ = auVar69._8_4_;
            auVar69._12_4_ = auVar69._8_4_;
            *pSVar40 = (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar110 & auVar64 | auVar159 & auVar110);
            pSVar40[1] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (~auVar69 & auVar68 | auVar108 & auVar69);
            pSVar40[2] = (StackItemT<embree::NodeRefPtr<4>_>)
                         (auVar68 & auVar69 | ~auVar69 & auVar108);
            pSVar40 = pSVar40 + 3;
            auVar68 = local_1278;
            fVar179 = local_11a8;
            fVar252 = fStack_11a4;
            fVar185 = fStack_11a0;
            fVar186 = fStack_119c;
          }
        }
      }
    }
  } while( true );
LAB_00676108:
  if (local_11e8 == local_11f0) goto LAB_00677bf8;
  lVar34 = local_11e8 * 0x58;
  local_11b8 = uVar48 + lVar34;
  uVar7 = *(undefined8 *)(uVar48 + 0x20 + lVar34);
  uVar30 = *(undefined4 *)(uVar48 + 0x24 + lVar34);
  bVar224 = (byte)uVar7;
  bVar194 = (byte)uVar30;
  bVar13 = (byte)((ulong)uVar7 >> 8);
  bVar213 = (byte)((uint)uVar30 >> 8);
  bVar14 = (byte)((ulong)uVar7 >> 0x10);
  bVar215 = (byte)((uint)uVar30 >> 0x10);
  bVar16 = (byte)((uint)uVar30 >> 0x18);
  bVar15 = (byte)((ulong)uVar7 >> 0x18);
  cVar195 = -((byte)((bVar224 < bVar194) * bVar224 | (bVar224 >= bVar194) * bVar194) == bVar224);
  cVar214 = -((byte)((bVar13 < bVar213) * bVar13 | (bVar13 >= bVar213) * bVar213) == bVar13);
  cVar216 = -((byte)((bVar14 < bVar215) * bVar14 | (bVar14 >= bVar215) * bVar215) == bVar14);
  cVar217 = -((byte)((bVar15 < bVar16) * bVar15 | (bVar15 >= bVar16) * bVar16) == bVar15);
  cVar218 = -((char)((ulong)uVar7 >> 0x20) == '\0');
  cVar221 = -((char)((ulong)uVar7 >> 0x28) == '\0');
  cVar222 = -((char)((ulong)uVar7 >> 0x30) == '\0');
  bVar224 = -((char)((ulong)uVar7 >> 0x38) == '\0');
  auVar203._0_9_ = CONCAT18(0xff,(ulong)bVar224 << 0x38);
  auVar199._0_10_ = CONCAT19(0xff,auVar203._0_9_);
  auVar199[10] = 0xff;
  auVar200[0xb] = 0xff;
  auVar200._0_11_ = auVar199;
  auVar201[0xc] = 0xff;
  auVar201._0_12_ = auVar200;
  auVar208[0xd] = 0xff;
  auVar208._0_13_ = auVar201;
  fVar106 = *(float *)(uVar48 + 0x38 + lVar34);
  fVar156 = *(float *)(uVar48 + 0x3c + lVar34);
  fVar180 = *(float *)(uVar48 + 0x44 + lVar34);
  uVar29 = *(uint *)(local_11f8 + 0x20 + local_11b8);
  auVar17[0xc] = (char)(uVar29 >> 0x18);
  auVar17._0_12_ = ZEXT712(0);
  uVar8 = *(uint *)(local_1200 + 0x20 + local_11b8);
  auVar18[0xc] = (char)(uVar8 >> 0x18);
  auVar18._0_12_ = ZEXT712(0);
  fVar168 = *(float *)(uVar48 + 0x48 + lVar34);
  uVar129 = *(uint *)(local_1208 + 0x20 + local_11b8);
  auVar19[0xc] = (char)(uVar129 >> 0x18);
  auVar19._0_12_ = ZEXT712(0);
  uVar145 = *(uint *)(local_1210 + 0x20 + local_11b8);
  auVar20[0xc] = (char)(uVar145 >> 0x18);
  auVar20._0_12_ = ZEXT712(0);
  fVar166 = *(float *)(uVar48 + 0x4c + lVar34);
  uVar146 = *(uint *)(local_1218 + 0x20 + local_11b8);
  auVar21[0xc] = (char)(uVar146 >> 0x18);
  auVar21._0_12_ = ZEXT712(0);
  uVar147 = *(uint *)(local_1220 + 0x20 + local_11b8);
  auVar22[0xc] = (char)(uVar147 >> 0x18);
  auVar22._0_12_ = ZEXT712(0);
  fVar177 = *(float *)(uVar48 + 0x40 + lVar34);
  auVar64._0_4_ = (((float)(uVar29 & 0xff) * fVar180 + fVar106) - auVar111._0_4_) * fVar179;
  auVar64._4_4_ = (((float)(uVar29 >> 8 & 0xff) * fVar180 + fVar106) - auVar111._4_4_) * fVar252;
  auVar64._8_4_ =
       (((float)(int)CONCAT32(auVar17._10_3_,(ushort)(byte)(uVar29 >> 0x10)) * fVar180 + fVar106) -
       auVar111._8_4_) * fVar185;
  auVar64._12_4_ =
       (((float)(uint3)(auVar17._10_3_ >> 0x10) * fVar180 + fVar106) - auVar111._12_4_) * fVar186;
  auVar149._0_4_ = (((float)(uVar129 & 0xff) * fVar168 + fVar156) - local_1188) * fVar187;
  auVar149._4_4_ = (((float)(uVar129 >> 8 & 0xff) * fVar168 + fVar156) - fStack_1184) * fVar176;
  auVar149._8_4_ =
       (((float)(int)CONCAT32(auVar19._10_3_,(ushort)(byte)(uVar129 >> 0x10)) * fVar168 + fVar156) -
       fStack_1180) * fVar230;
  auVar149._12_4_ =
       (((float)(uint3)(auVar19._10_3_ >> 0x10) * fVar168 + fVar156) - fStack_117c) * fVar178;
  auVar88 = maxps(auVar64,auVar149);
  auVar108._0_4_ = (((float)(uVar8 & 0xff) * fVar180 + fVar106) - auVar111._0_4_) * local_1198;
  auVar108._4_4_ = (((float)(uVar8 >> 8 & 0xff) * fVar180 + fVar106) - auVar111._4_4_) * fStack_1194
  ;
  auVar108._8_4_ =
       (((float)(int)CONCAT32(auVar18._10_3_,(ushort)(byte)(uVar8 >> 0x10)) * fVar180 + fVar106) -
       auVar111._8_4_) * fStack_1190;
  auVar108._12_4_ =
       (((float)(uint3)(auVar18._10_3_ >> 0x10) * fVar180 + fVar106) - auVar111._12_4_) *
       fStack_118c;
  auVar159._0_4_ = (((float)(uVar145 & 0xff) * fVar168 + fVar156) - local_1188) * fVar234;
  auVar159._4_4_ = (((float)(uVar145 >> 8 & 0xff) * fVar168 + fVar156) - fStack_1184) * fVar229;
  auVar159._8_4_ =
       (((float)(int)CONCAT32(auVar20._10_3_,(ushort)(byte)(uVar145 >> 0x10)) * fVar168 + fVar156) -
       fStack_1180) * fVar255;
  auVar159._12_4_ =
       (((float)(uint3)(auVar20._10_3_ >> 0x10) * fVar168 + fVar156) - fStack_117c) * fVar244;
  auVar111 = minps(auVar108,auVar159);
  auVar160._0_4_ = (((float)(uVar146 & 0xff) * fVar166 + fVar177) - fVar198) * fVar254;
  auVar160._4_4_ = (((float)(uVar146 >> 8 & 0xff) * fVar166 + fVar177) - fVar153) * fVar167;
  auVar160._8_4_ =
       (((float)(int)CONCAT32(auVar21._10_3_,(ushort)(byte)(uVar146 >> 0x10)) * fVar166 + fVar177) -
       fVar154) * fVar188;
  auVar160._12_4_ =
       (((float)(uint3)(auVar21._10_3_ >> 0x10) * fVar166 + fVar177) - fVar155) * fVar192;
  auVar68 = maxps(auVar160,local_1278);
  dist.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar88,auVar68);
  auVar169._0_4_ = (((float)(uVar147 & 0xff) * fVar166 + fVar177) - fVar198) * fVar243;
  auVar169._4_4_ = (((float)(uVar147 >> 8 & 0xff) * fVar166 + fVar177) - fVar153) * fVar157;
  auVar169._8_4_ =
       (((float)(int)CONCAT32(auVar22._10_3_,(ushort)(byte)(uVar147 >> 0x10)) * fVar166 + fVar177) -
       fVar154) * fVar164;
  auVar169._12_4_ =
       (((float)(uint3)(auVar22._10_3_ >> 0x10) * fVar166 + fVar177) - fVar155) * fVar165;
  auVar88 = minps(auVar169,local_1288);
  auVar111 = minps(auVar111,auVar88);
  auVar208[0xe] = bVar224;
  auVar208[0xf] = bVar224;
  auVar207._14_2_ = auVar208._14_2_;
  auVar207[0xd] = cVar222;
  auVar207._0_13_ = auVar201;
  auVar206._13_3_ = auVar207._13_3_;
  auVar206[0xc] = cVar222;
  auVar206._0_12_ = auVar200;
  auVar205._12_4_ = auVar206._12_4_;
  auVar205[0xb] = cVar221;
  auVar205._0_11_ = auVar199;
  auVar204._11_5_ = auVar205._11_5_;
  auVar204[10] = cVar221;
  auVar204._0_10_ = auVar199._0_10_;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203[9] = cVar218;
  Var26 = CONCAT91(CONCAT81((long)(CONCAT72(auVar203._9_7_,CONCAT11(cVar218,bVar224)) >> 8),cVar217)
                   ,cVar217);
  auVar25._2_10_ = Var26;
  auVar25[1] = cVar216;
  auVar25[0] = cVar216;
  auVar24._2_12_ = auVar25;
  auVar24[1] = cVar214;
  auVar24[0] = cVar214;
  auVar202._0_2_ = CONCAT11(cVar195,cVar195);
  auVar202._2_14_ = auVar24;
  uVar223 = (undefined2)Var26;
  auVar211._0_12_ = auVar202._0_12_;
  auVar211._12_2_ = uVar223;
  auVar211._14_2_ = uVar223;
  auVar210._12_4_ = auVar211._12_4_;
  auVar210._0_10_ = auVar202._0_10_;
  auVar210._10_2_ = auVar25._0_2_;
  auVar209._10_6_ = auVar210._10_6_;
  auVar209._0_8_ = auVar202._0_8_;
  auVar209._8_2_ = auVar25._0_2_;
  auVar27._4_8_ = auVar209._8_8_;
  auVar27._2_2_ = auVar24._0_2_;
  auVar27._0_2_ = auVar24._0_2_;
  uVar29 = CONCAT22(auVar202._0_2_,auVar202._0_2_);
  auVar85._0_4_ = -(uint)(dist.field_0._0_4_ <= auVar111._0_4_) & uVar29;
  auVar85._4_4_ = -(uint)(dist.field_0._4_4_ <= auVar111._4_4_) & auVar27._0_4_;
  auVar85._8_4_ = -(uint)(dist.field_0._8_4_ <= auVar111._8_4_) & auVar209._8_4_;
  auVar85._12_4_ = -(uint)(dist.field_0._12_4_ <= auVar111._12_4_) & auVar210._12_4_;
  uVar30 = movmskps((int)lVar34,auVar85);
  local_1380 = CONCAT44((int)((ulong)lVar34 >> 0x20),uVar30);
  auVar68 = local_1278;
  while (local_1380 != 0) {
    lVar34 = 0;
    if (local_1380 != 0) {
      for (; (local_1380 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
      }
    }
    local_1380 = local_1380 - 1 & local_1380;
    fVar106 = *(float *)(ray + k * 4 + 0x80);
    if (*(float *)((long)&stack[-1].ptr.ptr + lVar34 * 4) <= fVar106) {
      local_1258 = ZEXT416((uint)fVar106);
      uVar29 = *(uint *)(local_11b8 + 0x50);
      uVar39 = (ulong)uVar29;
      uVar8 = *(uint *)(local_11b8 + 4 + lVar34 * 8);
      pSVar35 = context->scene;
      pGVar10 = (pSVar35->geometries).items[uVar39].ptr;
      lVar11 = *(long *)&pGVar10->field_0x58;
      lVar12 = *(long *)&pGVar10[1].time_range.upper;
      lVar42 = (ulong)uVar8 *
               pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar41 = *(ulong *)(local_11b8 + lVar34 * 8);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar41;
      uVar43 = *(ulong *)(lVar11 + lVar42);
      uVar45 = (ulong)((int)((ulong)(SUB164(auVar70 & _DAT_01f76ac0,0) >> 0x10) * (uVar43 >> 0x20))
                      + (int)uVar43 + (uint)SUB162(auVar70 & _DAT_01f76ac0,0));
      p_Var37 = pGVar10[1].intersectionFilterN;
      pfVar5 = (float *)(lVar12 + (long)p_Var37 * uVar45);
      pfVar1 = (float *)(lVar12 + (uVar45 + 1) * (long)p_Var37);
      local_1048 = pfVar1[1];
      fVar198 = pfVar1[2];
      uVar43 = uVar43 >> 0x20;
      lVar34 = uVar45 + uVar43 + 1;
      pfVar2 = (float *)(lVar12 + (uVar45 + uVar43) * (long)p_Var37);
      fVar156 = *pfVar2;
      local_1058 = pfVar2[1];
      local_1478 = pfVar2[2];
      pfVar2 = (float *)(lVar12 + lVar34 * (long)p_Var37);
      fVar180 = *pfVar2;
      fVar168 = pfVar2[1];
      fVar166 = pfVar2[2];
      uVar46 = (ulong)(-1 < (short)uVar41);
      pfVar2 = (float *)(lVar12 + (uVar45 + uVar46 + 1) * (long)p_Var37);
      fVar234 = pfVar2[2];
      lVar44 = uVar46 + lVar34;
      pfVar3 = (float *)(lVar12 + lVar44 * (long)p_Var37);
      fVar187 = *pfVar3;
      fVar176 = pfVar3[1];
      fVar230 = pfVar3[2];
      uVar46 = 0;
      if (-1 < (short)(uVar41 >> 0x10)) {
        uVar46 = uVar43;
      }
      pfVar3 = (float *)(lVar12 + (uVar45 + uVar43 + uVar46) * (long)p_Var37);
      pfVar4 = (float *)(lVar12 + (lVar34 + uVar46) * (long)p_Var37);
      fVar178 = pfVar4[1];
      fVar177 = *(float *)(lVar12 + (uVar46 + lVar44) * (long)p_Var37 + 4);
      fVar243 = *(float *)(ray + k * 4);
      local_f98 = *pfVar5 - fVar243;
      fStack_f94 = *pfVar1 - fVar243;
      fStack_f90 = fVar180 - fVar243;
      fStack_f8c = fVar156 - fVar243;
      fStack_1228 = fVar187;
      fStack_1224 = fVar180;
      fVar196 = *pfVar1 - fVar243;
      fVar219 = *pfVar2 - fVar243;
      fVar225 = fVar187 - fVar243;
      fVar227 = fVar180 - fVar243;
      local_1248 = CONCAT44(fVar180,fVar156);
      local_1238 = *pfVar4;
      fStack_1234 = *pfVar3;
      fVar156 = fVar156 - fVar243;
      fVar185 = fVar180 - fVar243;
      fVar186 = *pfVar4 - fVar243;
      fVar243 = *pfVar3 - fVar243;
      fVar229 = *(float *)(ray + k * 4 + 0x10);
      fVar255 = *(float *)(ray + k * 4 + 0x20);
      local_fa8 = pfVar5[1] - fVar229;
      fStack_fa4 = local_1048 - fVar229;
      fStack_fa0 = fVar168 - fVar229;
      fStack_f9c = local_1058 - fVar229;
      local_1268._0_4_ = pfVar5[2] - fVar255;
      local_1268._4_4_ = fVar198 - fVar255;
      fStack_1260 = fVar166 - fVar255;
      fStack_125c = local_1478 - fVar255;
      fStack_1054 = fVar168;
      fStack_1050 = fVar178;
      fStack_104c = pfVar3[1];
      local_1438 = local_1058 - fVar229;
      fStack_1434 = fVar168 - fVar229;
      fStack_1430 = fVar178 - fVar229;
      fStack_142c = pfVar3[1] - fVar229;
      local_1038 = CONCAT44(fVar166,local_1478);
      local_1028 = pfVar4[2];
      fStack_1024 = pfVar3[2];
      local_1478 = local_1478 - fVar255;
      fStack_1474 = fVar166 - fVar255;
      fStack_1470 = pfVar4[2] - fVar255;
      fStack_146c = pfVar3[2] - fVar255;
      local_fb8 = fVar156 - local_f98;
      fStack_fb4 = fVar185 - fStack_f94;
      fStack_fb0 = fVar186 - fStack_f90;
      fStack_fac = fVar243 - fStack_f8c;
      local_fd8 = local_1438 - local_fa8;
      fStack_fd4 = fStack_1434 - fStack_fa4;
      fStack_fd0 = fStack_1430 - fStack_fa0;
      fStack_fcc = fStack_142c - fStack_f9c;
      local_fc8 = local_1478 - (float)local_1268._0_4_;
      fStack_fc4 = fStack_1474 - (float)local_1268._4_4_;
      fStack_fc0 = fStack_1470 - fStack_1260;
      fStack_fbc = fStack_146c - fStack_125c;
      local_1488._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
      local_1488._0_4_ = local_1488._4_4_;
      fStack_1480 = (float)local_1488._4_4_;
      fStack_147c = (float)local_1488._4_4_;
      fStack_148c = *(float *)(ray + k * 4 + 0x60);
      fStack_1400 = *(float *)(ray + k * 4 + 0x40);
      fVar256 = (local_fd8 * (local_1478 + (float)local_1268._0_4_) -
                (local_1438 + local_fa8) * local_fc8) * fStack_1400 +
                ((fVar156 + local_f98) * local_fc8 -
                (local_1478 + (float)local_1268._0_4_) * local_fb8) * (float)local_1488._4_4_ +
                (local_fb8 * (local_1438 + local_fa8) - (fVar156 + local_f98) * local_fd8) *
                fStack_148c;
      fVar258 = (fStack_fd4 * (fStack_1474 + (float)local_1268._4_4_) -
                (fStack_1434 + fStack_fa4) * fStack_fc4) * fStack_1400 +
                ((fVar185 + fStack_f94) * fStack_fc4 -
                (fStack_1474 + (float)local_1268._4_4_) * fStack_fb4) * (float)local_1488._4_4_ +
                (fStack_fb4 * (fStack_1434 + fStack_fa4) - (fVar185 + fStack_f94) * fStack_fd4) *
                fStack_148c;
      local_1008._0_8_ = CONCAT44(fVar258,fVar256);
      local_1008._8_4_ =
           (fStack_fd0 * (fStack_1470 + fStack_1260) - (fStack_1430 + fStack_fa0) * fStack_fc0) *
           fStack_1400 +
           ((fVar186 + fStack_f90) * fStack_fc0 - (fStack_1470 + fStack_1260) * fStack_fb0) *
           (float)local_1488._4_4_ +
           (fStack_fb0 * (fStack_1430 + fStack_fa0) - (fVar186 + fStack_f90) * fStack_fd0) *
           fStack_148c;
      local_1008._12_4_ =
           (fStack_fcc * (fStack_146c + fStack_125c) - (fStack_142c + fStack_f9c) * fStack_fbc) *
           fStack_1400 +
           ((fVar243 + fStack_f8c) * fStack_fbc - (fStack_146c + fStack_125c) * fStack_fac) *
           (float)local_1488._4_4_ +
           (fStack_fac * (fStack_142c + fStack_f9c) - (fVar243 + fStack_f8c) * fStack_fcc) *
           fStack_148c;
      fStack_1044 = pfVar2[1];
      fStack_1040 = fVar176;
      fStack_103c = fVar168;
      fVar179 = local_1048 - fVar229;
      fVar153 = pfVar2[1] - fVar229;
      fVar154 = fVar176 - fVar229;
      fVar155 = fVar168 - fVar229;
      fVar244 = fVar198 - fVar255;
      fVar247 = fVar234 - fVar255;
      fVar250 = fStack_1350 - fVar255;
      fVar252 = fStack_134c - fVar255;
      local_ff8 = local_f98 - fVar196;
      fStack_ff4 = fStack_f94 - fVar219;
      fStack_ff0 = fStack_f90 - fVar225;
      fStack_fec = fStack_f8c - fVar227;
      fVar235 = local_fa8 - fVar179;
      fVar237 = fStack_fa4 - fVar153;
      fVar239 = fStack_fa0 - fVar154;
      fVar241 = fStack_f9c - fVar155;
      local_fe8 = (float)local_1268._0_4_ - fVar244;
      fStack_fe4 = (float)local_1268._4_4_ - fVar247;
      fStack_fe0 = fStack_1260 - fVar250;
      fStack_fdc = fStack_125c - fVar252;
      auVar89._0_4_ =
           (fVar235 * ((float)local_1268._0_4_ + fVar244) - (local_fa8 + fVar179) * local_fe8) *
           fStack_1400 +
           ((local_f98 + fVar196) * local_fe8 - ((float)local_1268._0_4_ + fVar244) * local_ff8) *
           (float)local_1488._4_4_ +
           (local_ff8 * (local_fa8 + fVar179) - (local_f98 + fVar196) * fVar235) * fStack_148c;
      auVar89._4_4_ =
           (fVar237 * ((float)local_1268._4_4_ + fVar247) - (fStack_fa4 + fVar153) * fStack_fe4) *
           fStack_1400 +
           ((fStack_f94 + fVar219) * fStack_fe4 - ((float)local_1268._4_4_ + fVar247) * fStack_ff4)
           * (float)local_1488._4_4_ +
           (fStack_ff4 * (fStack_fa4 + fVar153) - (fStack_f94 + fVar219) * fVar237) * fStack_148c;
      auVar89._8_4_ =
           (fVar239 * (fStack_1260 + fVar250) - (fStack_fa0 + fVar154) * fStack_fe0) * fStack_1400 +
           ((fStack_f90 + fVar225) * fStack_fe0 - (fStack_1260 + fVar250) * fStack_ff0) *
           (float)local_1488._4_4_ +
           (fStack_ff0 * (fStack_fa0 + fVar154) - (fStack_f90 + fVar225) * fVar239) * fStack_148c;
      auVar89._12_4_ =
           (fVar241 * (fStack_125c + fVar252) - (fStack_f9c + fVar155) * fStack_fdc) * fStack_1400 +
           ((fStack_f8c + fVar227) * fStack_fdc - (fStack_125c + fVar252) * fStack_fec) *
           (float)local_1488._4_4_ +
           (fStack_fec * (fStack_f9c + fVar155) - (fStack_f8c + fVar227) * fVar241) * fStack_148c;
      fVar197 = fVar196 - fVar156;
      fVar220 = fVar219 - fVar185;
      fVar226 = fVar225 - fVar186;
      fVar228 = fVar227 - fVar243;
      fVar157 = fVar179 - local_1438;
      fVar164 = fVar153 - fStack_1434;
      fVar165 = fVar154 - fStack_1430;
      fVar167 = fVar155 - fStack_142c;
      fVar188 = fVar244 - local_1478;
      fVar192 = fVar247 - fStack_1474;
      fVar254 = fVar250 - fStack_1470;
      fVar193 = fVar252 - fStack_146c;
      local_1368 = fVar179 + local_1438;
      fStack_1364 = fVar153 + fStack_1434;
      fStack_1360 = fVar154 + fStack_1430;
      fStack_135c = fVar155 + fStack_142c;
      local_1448 = fVar244 + local_1478;
      fStack_1444 = fVar247 + fStack_1474;
      fStack_1440 = fVar250 + fStack_1470;
      fStack_143c = fVar252 + fStack_146c;
      auVar71._0_4_ =
           (fVar157 * local_1448 - local_1368 * fVar188) * fStack_1400 +
           ((fVar156 + fVar196) * fVar188 - fVar197 * local_1448) * (float)local_1488._4_4_ +
           (fVar197 * local_1368 - (fVar156 + fVar196) * fVar157) * fStack_148c;
      auVar71._4_4_ =
           (fVar164 * fStack_1444 - fStack_1364 * fVar192) * fStack_1400 +
           ((fVar185 + fVar219) * fVar192 - fVar220 * fStack_1444) * (float)local_1488._4_4_ +
           (fVar220 * fStack_1364 - (fVar185 + fVar219) * fVar164) * fStack_148c;
      auVar71._8_4_ =
           (fVar165 * fStack_1440 - fStack_1360 * fVar254) * fStack_1400 +
           ((fVar186 + fVar225) * fVar254 - fVar226 * fStack_1440) * (float)local_1488._4_4_ +
           (fVar226 * fStack_1360 - (fVar186 + fVar225) * fVar165) * fStack_148c;
      auVar71._12_4_ =
           (fVar167 * fStack_143c - fStack_135c * fVar193) * fStack_1400 +
           ((fVar243 + fVar227) * fVar193 - fVar228 * fStack_143c) * (float)local_1488._4_4_ +
           (fVar228 * fStack_135c - (fVar243 + fVar227) * fVar167) * fStack_148c;
      local_1018 = fVar256 + auVar89._0_4_ + auVar71._0_4_;
      fStack_1014 = fVar258 + auVar89._4_4_ + auVar71._4_4_;
      fStack_1010 = local_1008._8_4_ + auVar89._8_4_ + auVar71._8_4_;
      fStack_100c = local_1008._12_4_ + auVar89._12_4_ + auVar71._12_4_;
      auVar170._8_4_ = local_1008._8_4_;
      auVar170._0_8_ = local_1008._0_8_;
      auVar170._12_4_ = local_1008._12_4_;
      auVar111 = minps(auVar170,auVar89);
      auVar111 = minps(auVar111,auVar71);
      auVar181._8_4_ = local_1008._8_4_;
      auVar181._0_8_ = local_1008._0_8_;
      auVar181._12_4_ = local_1008._12_4_;
      auVar88 = maxps(auVar181,auVar89);
      auVar88 = maxps(auVar88,auVar71);
      uVar129 = (uint)DAT_01f46710;
      uVar145 = DAT_01f46710._4_4_;
      uVar146 = DAT_01f46710._8_4_;
      uVar147 = DAT_01f46710._12_4_;
      fVar156 = (float)((uint)local_1018 & uVar129);
      fVar243 = (float)((uint)fStack_1014 & uVar145);
      fVar185 = (float)((uint)fStack_1010 & uVar146);
      fVar186 = (float)((uint)fStack_100c & uVar147);
      auVar182._4_4_ = -(uint)(auVar88._4_4_ <= fVar243 * 1.1920929e-07);
      auVar182._0_4_ = -(uint)(auVar88._0_4_ <= fVar156 * 1.1920929e-07);
      auVar182._8_4_ = -(uint)(auVar88._8_4_ <= fVar185 * 1.1920929e-07);
      auVar182._12_4_ = -(uint)(auVar88._12_4_ <= fVar186 * 1.1920929e-07);
      auVar171._4_4_ = -(uint)(-(fVar243 * 1.1920929e-07) <= auVar111._4_4_);
      auVar171._0_4_ = -(uint)(-(fVar156 * 1.1920929e-07) <= auVar111._0_4_);
      auVar171._8_4_ = -(uint)(-(fVar185 * 1.1920929e-07) <= auVar111._8_4_);
      auVar171._12_4_ = -(uint)(-(fVar186 * 1.1920929e-07) <= auVar111._12_4_);
      auVar182 = auVar182 | auVar171;
      iVar38 = movmskps((int)lVar12,auVar182);
      sx.field_0.i[0] = (int)fVar230;
      sx.field_0.i[1] = (int)fVar230;
      sx.field_0.i[2] = (int)fVar230;
      sx.field_0.i[3] = (int)fVar230;
      local_1168 = ZEXT416(uVar29);
      local_1178 = ZEXT416(uVar8);
      fStack_13fc = fStack_1400;
      if (iVar38 == 0) {
LAB_0067713b:
        uVar29 = (uint)pSVar35;
      }
      else {
        local_1028 = fVar156;
        fStack_1024 = fVar243;
        fStack_1020 = fVar185;
        fStack_101c = fVar186;
        uVar49 = -(uint)((float)((uint)(fVar157 * local_fe8) & uVar129) <=
                        (float)((uint)(fVar235 * local_fc8) & uVar129));
        uVar51 = -(uint)((float)((uint)(fVar164 * fStack_fe4) & uVar145) <=
                        (float)((uint)(fVar237 * fStack_fc4) & uVar145));
        uVar55 = -(uint)((float)((uint)(fVar165 * fStack_fe0) & uVar146) <=
                        (float)((uint)(fVar239 * fStack_fc0) & uVar146));
        uVar59 = -(uint)((float)((uint)(fVar167 * fStack_fdc) & uVar147) <=
                        (float)((uint)(fVar241 * fStack_fbc) & uVar147));
        uVar50 = -(uint)((float)((uint)(local_ff8 * fVar188) & uVar129) <=
                        (float)((uint)(local_fb8 * local_fe8) & uVar129));
        uVar52 = -(uint)((float)((uint)(fStack_ff4 * fVar192) & uVar145) <=
                        (float)((uint)(fStack_fb4 * fStack_fe4) & uVar145));
        uVar56 = -(uint)((float)((uint)(fStack_ff0 * fVar254) & uVar146) <=
                        (float)((uint)(fStack_fb0 * fStack_fe0) & uVar146));
        uVar60 = -(uint)((float)((uint)(fStack_fec * fVar193) & uVar147) <=
                        (float)((uint)(fStack_fac * fStack_fdc) & uVar147));
        uVar129 = -(uint)((float)((uint)(fVar197 * fVar235) & uVar129) <=
                         (float)((uint)(local_ff8 * local_fd8) & uVar129));
        uVar53 = -(uint)((float)((uint)(fVar220 * fVar237) & uVar145) <=
                        (float)((uint)(fStack_ff4 * fStack_fd4) & uVar145));
        uVar57 = -(uint)((float)((uint)(fVar226 * fVar239) & uVar146) <=
                        (float)((uint)(fStack_ff0 * fStack_fd0) & uVar146));
        uVar61 = -(uint)((float)((uint)(fVar228 * fVar241) & uVar147) <=
                        (float)((uint)(fStack_fec * fStack_fcc) & uVar147));
        local_12b8._0_4_ =
             ~uVar49 & (uint)(local_fd8 * local_fe8 - fVar235 * local_fc8) |
             (uint)(fVar235 * fVar188 - fVar157 * local_fe8) & uVar49;
        local_12b8._4_4_ =
             ~uVar51 & (uint)(fStack_fd4 * fStack_fe4 - fVar237 * fStack_fc4) |
             (uint)(fVar237 * fVar192 - fVar164 * fStack_fe4) & uVar51;
        fStack_12b0 = (float)(~uVar55 & (uint)(fStack_fd0 * fStack_fe0 - fVar239 * fStack_fc0) |
                             (uint)(fVar239 * fVar254 - fVar165 * fStack_fe0) & uVar55);
        fStack_12ac = (float)(~uVar59 & (uint)(fStack_fcc * fStack_fdc - fVar241 * fStack_fbc) |
                             (uint)(fVar241 * fVar193 - fVar167 * fStack_fdc) & uVar59);
        local_12a8._0_4_ =
             ~uVar50 & (uint)(local_fc8 * local_ff8 - local_fb8 * local_fe8) |
             (uint)(fVar197 * local_fe8 - local_ff8 * fVar188) & uVar50;
        local_12a8._4_4_ =
             ~uVar52 & (uint)(fStack_fc4 * fStack_ff4 - fStack_fb4 * fStack_fe4) |
             (uint)(fVar220 * fStack_fe4 - fStack_ff4 * fVar192) & uVar52;
        fStack_12a0 = (float)(~uVar56 & (uint)(fStack_fc0 * fStack_ff0 - fStack_fb0 * fStack_fe0) |
                             (uint)(fVar226 * fStack_fe0 - fStack_ff0 * fVar254) & uVar56);
        fStack_129c = (float)(~uVar60 & (uint)(fStack_fbc * fStack_fec - fStack_fac * fStack_fdc) |
                             (uint)(fVar228 * fStack_fdc - fStack_fec * fVar193) & uVar60);
        local_1298[0] =
             (float)(~uVar129 & (uint)(local_fb8 * fVar235 - local_ff8 * local_fd8) |
                    (uint)(local_ff8 * fVar157 - fVar197 * fVar235) & uVar129);
        local_1298[1] =
             (float)(~uVar53 & (uint)(fStack_fb4 * fVar237 - fStack_ff4 * fStack_fd4) |
                    (uint)(fStack_ff4 * fVar164 - fVar220 * fVar237) & uVar53);
        local_1298[2] =
             (float)(~uVar57 & (uint)(fStack_fb0 * fVar239 - fStack_ff0 * fStack_fd0) |
                    (uint)(fStack_ff0 * fVar165 - fVar226 * fVar239) & uVar57);
        local_1298[3] =
             (float)(~uVar61 & (uint)(fStack_fac * fVar241 - fStack_fec * fStack_fcc) |
                    (uint)(fStack_fec * fVar167 - fVar228 * fVar241) & uVar61);
        fVar157 = fStack_1400 * (float)local_12b8._0_4_ +
                  (float)local_1488._4_4_ * (float)local_12a8._0_4_ + fStack_148c * local_1298[0];
        fVar164 = fStack_1400 * (float)local_12b8._4_4_ +
                  (float)local_1488._4_4_ * (float)local_12a8._4_4_ + fStack_148c * local_1298[1];
        fVar165 = fStack_1400 * fStack_12b0 +
                  (float)local_1488._4_4_ * fStack_12a0 + fStack_148c * local_1298[2];
        fVar167 = fStack_1400 * fStack_12ac +
                  (float)local_1488._4_4_ * fStack_129c + fStack_148c * local_1298[3];
        auVar112._0_4_ = fVar157 + fVar157;
        auVar112._4_4_ = fVar164 + fVar164;
        auVar112._8_4_ = fVar165 + fVar165;
        auVar112._12_4_ = fVar167 + fVar167;
        auVar72._0_4_ = (float)local_1268._0_4_ * local_1298[0];
        auVar72._4_4_ = (float)local_1268._4_4_ * local_1298[1];
        auVar72._8_4_ = fStack_1260 * local_1298[2];
        auVar72._12_4_ = fStack_125c * local_1298[3];
        fVar188 = local_f98 * (float)local_12b8._0_4_ +
                  local_fa8 * (float)local_12a8._0_4_ + auVar72._0_4_;
        fVar192 = fStack_f94 * (float)local_12b8._4_4_ +
                  fStack_fa4 * (float)local_12a8._4_4_ + auVar72._4_4_;
        fVar254 = fStack_f90 * fStack_12b0 + fStack_fa0 * fStack_12a0 + auVar72._8_4_;
        fVar193 = fStack_f8c * fStack_12ac + fStack_f9c * fStack_129c + auVar72._12_4_;
        auVar111 = rcpps(auVar72,auVar112);
        fVar157 = auVar111._0_4_;
        fVar164 = auVar111._4_4_;
        fVar165 = auVar111._8_4_;
        fVar167 = auVar111._12_4_;
        fVar188 = ((1.0 - auVar112._0_4_ * fVar157) * fVar157 + fVar157) * (fVar188 + fVar188);
        fVar164 = ((1.0 - auVar112._4_4_ * fVar164) * fVar164 + fVar164) * (fVar192 + fVar192);
        fVar165 = ((1.0 - auVar112._8_4_ * fVar165) * fVar165 + fVar165) * (fVar254 + fVar254);
        fVar167 = ((1.0 - auVar112._12_4_ * fVar167) * fVar167 + fVar167) * (fVar193 + fVar193);
        fVar157 = *(float *)(ray + k * 4 + 0x30);
        iVar54 = -(uint)(fVar157 <= fVar164);
        iVar58 = -(uint)(fVar157 <= fVar165);
        iVar62 = -(uint)(fVar157 <= fVar167);
        auVar135._8_4_ = iVar58;
        auVar135._4_4_ = iVar54;
        auVar135._12_4_ = iVar62;
        auVar73._0_4_ = -(uint)(fVar188 <= fVar106 && fVar157 <= fVar188) & auVar182._0_4_;
        auVar73._4_4_ = -(uint)(fVar164 <= fVar106 && fVar157 <= fVar164) & auVar182._4_4_;
        auVar73._8_4_ = -(uint)(fVar165 <= fVar106 && fVar157 <= fVar165) & auVar182._8_4_;
        auVar73._12_4_ = -(uint)(fVar167 <= fVar106 && fVar157 <= fVar167) & auVar182._12_4_;
        iVar38 = movmskps(iVar38,auVar73);
        if (iVar38 == 0) goto LAB_0067713b;
        valid.field_0.i[0] = auVar73._0_4_ & -(uint)(auVar112._0_4_ != 0.0);
        valid.field_0.i[1] = auVar73._4_4_ & -(uint)(auVar112._4_4_ != 0.0);
        valid.field_0.i[2] = auVar73._8_4_ & -(uint)(auVar112._8_4_ != 0.0);
        valid.field_0.i[3] = auVar73._12_4_ & -(uint)(auVar112._12_4_ != 0.0);
        iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
        if (iVar38 == 0) goto LAB_0067713b;
        auVar23._4_4_ = fStack_1014;
        auVar23._0_4_ = local_1018;
        auVar23._8_4_ = fStack_1010;
        auVar23._12_4_ = fStack_100c;
        local_12c8._4_4_ = fVar164;
        local_12c8._0_4_ = fVar188;
        fStack_12c0 = fVar165;
        fStack_12bc = fVar167;
        auVar135._0_4_ = (float)(int)(*(ushort *)(lVar11 + 8 + lVar42) - 1);
        auVar183._4_4_ = iVar54;
        auVar183._0_4_ = auVar135._0_4_;
        auVar183._8_4_ = iVar58;
        auVar183._12_4_ = iVar62;
        auVar111 = rcpss(auVar183,auVar135);
        auVar189._0_4_ = (float)(int)(*(ushort *)(lVar11 + 10 + lVar42) - 1);
        auVar189._4_12_ = DAT_01f46710._4_12_;
        fVar106 = (2.0 - auVar135._0_4_ * auVar111._0_4_) * auVar111._0_4_;
        auVar184._4_4_ = uVar145;
        auVar184._0_4_ = auVar189._0_4_;
        auVar184._8_4_ = uVar146;
        auVar184._12_4_ = uVar147;
        auVar111 = rcpss(auVar184,auVar189);
        fVar157 = (2.0 - auVar189._0_4_ * auVar111._0_4_) * auVar111._0_4_;
        tNear.field_0.v[0] = fVar106 * (fVar256 + (float)(int)fVar230 * local_1018);
        tNear.field_0.v[1] = fVar106 * (fVar258 + (float)((int)fVar230 + 1) * fStack_1014);
        tNear.field_0.v[2] = fVar106 * (local_1008._8_4_ + (float)((int)fVar230 + 1) * fStack_1010);
        tNear.field_0.v[3] = fVar106 * (local_1008._12_4_ + (float)(int)fVar230 * fStack_100c);
        auVar150._0_4_ = (float)(int)fVar166 * local_1018 + auVar89._0_4_;
        auVar150._4_4_ = (float)(int)fVar166 * fStack_1014 + auVar89._4_4_;
        auVar150._8_4_ = (float)((int)fVar166 + 1) * fStack_1010 + auVar89._8_4_;
        auVar150._12_4_ = (float)((int)fVar166 + 1) * fStack_100c + auVar89._12_4_;
        pGVar10 = (pSVar35->geometries).items[uVar39].ptr;
        uVar129 = *(uint *)(ray + k * 4 + 0x90);
        pSVar35 = (Scene *)(ulong)uVar129;
        if ((pGVar10->mask & uVar129) == 0) goto LAB_0067713b;
        auVar111 = rcpps(auVar150,auVar23);
        fVar106 = auVar111._0_4_;
        fVar192 = auVar111._4_4_;
        fVar254 = auVar111._8_4_;
        fVar193 = auVar111._12_4_;
        fVar106 = (float)(-(uint)(1e-18 <= fVar156) &
                         (uint)(((float)DAT_01f46a60 - local_1018 * fVar106) * fVar106 + fVar106));
        fVar156 = (float)(-(uint)(1e-18 <= fVar243) &
                         (uint)((DAT_01f46a60._4_4_ - fStack_1014 * fVar192) * fVar192 + fVar192));
        fVar243 = (float)(-(uint)(1e-18 <= fVar185) &
                         (uint)((DAT_01f46a60._8_4_ - fStack_1010 * fVar254) * fVar254 + fVar254));
        fVar185 = (float)(-(uint)(1e-18 <= fVar186) &
                         (uint)((DAT_01f46a60._12_4_ - fStack_100c * fVar193) * fVar193 + fVar193));
        auVar113._0_4_ = tNear.field_0.v[0] * fVar106;
        auVar113._4_4_ = tNear.field_0.v[1] * fVar156;
        auVar113._8_4_ = tNear.field_0.v[2] * fVar243;
        auVar113._12_4_ = tNear.field_0.v[3] * fVar185;
        local_12e8 = minps(auVar113,_DAT_01f46a60);
        auVar136._0_4_ = fVar157 * auVar150._0_4_ * fVar106;
        auVar136._4_4_ = fVar157 * auVar150._4_4_ * fVar156;
        auVar136._8_4_ = fVar157 * auVar150._8_4_ * fVar243;
        auVar136._12_4_ = fVar157 * auVar150._12_4_ * fVar185;
        local_12d8 = minps(auVar136,_DAT_01f46a60);
        auVar90._0_4_ = (uint)fVar188 & valid.field_0.i[0];
        auVar90._4_4_ = (uint)fVar164 & valid.field_0.i[1];
        auVar90._8_4_ = (uint)fVar165 & valid.field_0.i[2];
        auVar90._12_4_ = (uint)fVar167 & valid.field_0.i[3];
        auVar114._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
        auVar114._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
        auVar114._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
        auVar114 = auVar114 | auVar90;
        auVar137._4_4_ = auVar114._0_4_;
        auVar137._0_4_ = auVar114._4_4_;
        auVar137._8_4_ = auVar114._12_4_;
        auVar137._12_4_ = auVar114._8_4_;
        auVar111 = minps(auVar137,auVar114);
        auVar91._0_8_ = auVar111._8_8_;
        auVar91._8_4_ = auVar111._0_4_;
        auVar91._12_4_ = auVar111._4_4_;
        auVar111 = minps(auVar91,auVar111);
        uVar49 = -(uint)(auVar111._0_4_ == auVar114._0_4_);
        uVar50 = -(uint)(auVar111._4_4_ == auVar114._4_4_);
        uVar51 = -(uint)(auVar111._8_4_ == auVar114._8_4_);
        uVar52 = -(uint)(auVar111._12_4_ == auVar114._12_4_);
        auVar115._0_4_ = uVar49 & valid.field_0.i[0];
        auVar115._4_4_ = uVar50 & valid.field_0.i[1];
        auVar115._8_4_ = uVar51 & valid.field_0.i[2];
        auVar115._12_4_ = uVar52 & valid.field_0.i[3];
        iVar38 = movmskps(uVar129,auVar115);
        uVar129 = 0xffffffff;
        uVar145 = 0xffffffff;
        uVar146 = 0xffffffff;
        uVar147 = 0xffffffff;
        if (iVar38 != 0) {
          uVar129 = uVar49;
          uVar145 = uVar50;
          uVar146 = uVar51;
          uVar147 = uVar52;
        }
        auVar74._0_4_ = valid.field_0.i[0] & uVar129;
        auVar74._4_4_ = valid.field_0.i[1] & uVar145;
        auVar74._8_4_ = valid.field_0.i[2] & uVar146;
        auVar74._12_4_ = valid.field_0.i[3] & uVar147;
        uVar129 = movmskps(iVar38,auVar74);
        lVar34 = 0;
        if (uVar129 != 0) {
          for (; (uVar129 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar30 = *(undefined4 *)(local_12e8 + lVar34 * 4);
          uVar6 = *(undefined4 *)(local_12d8 + lVar34 * 4);
          uVar31 = *(undefined4 *)(local_12b8 + lVar34 * 4);
          fVar106 = local_1298[lVar34 + -4];
          fVar198 = local_1298[lVar34];
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12c8 + lVar34 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar31;
          *(float *)(ray + k * 4 + 0xd0) = fVar106;
          *(float *)(ray + k * 4 + 0xe0) = fVar198;
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
          *(uint *)(ray + k * 4 + 0x110) = uVar8;
          *(uint *)(ray + k * 4 + 0x120) = uVar29;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar29 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar29;
        }
        else {
          auVar25 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar32);
          fStack_142c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar32 + 8) >> 0x20);
          _local_1488 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
          fStack_1404 = 0.0;
          local_1408 = (float)uVar29;
          while( true ) {
            local_1118 = *(undefined4 *)(local_12e8 + lVar34 * 4);
            local_1108._4_4_ = *(undefined4 *)(local_12d8 + lVar34 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12c8 + lVar34 * 4);
            args.context = context->user;
            local_1148 = *(undefined4 *)(local_12b8 + lVar34 * 4);
            local_1138._4_4_ = local_1298[lVar34 + -4];
            local_1128._4_4_ = local_1298[lVar34];
            uStack_1144 = local_1148;
            uStack_1140 = local_1148;
            uStack_113c = local_1148;
            local_1138._0_4_ = local_1138._4_4_;
            fStack_1130 = (float)local_1138._4_4_;
            fStack_112c = (float)local_1138._4_4_;
            local_1128._0_4_ = local_1128._4_4_;
            fStack_1120 = (float)local_1128._4_4_;
            fStack_111c = (float)local_1128._4_4_;
            uStack_1114 = local_1118;
            uStack_1110 = local_1118;
            uStack_110c = local_1118;
            local_1108._0_4_ = local_1108._4_4_;
            local_1108._8_4_ = local_1108._4_4_;
            local_1108._12_4_ = local_1108._4_4_;
            local_10f8 = CONCAT44(uVar8,uVar8);
            uStack_10f0 = CONCAT44(uVar8,uVar8);
            local_10e8 = CONCAT44(uVar29,uVar29);
            uStack_10e0 = CONCAT44(uVar29,uVar29);
            local_10d8 = (args.context)->instID[0];
            uStack_10d4 = local_10d8;
            uStack_10d0 = local_10d8;
            uStack_10cc = local_10d8;
            local_10c8 = (args.context)->instPrimID[0];
            uStack_10c4 = local_10c8;
            uStack_10c0 = local_10c8;
            uStack_10bc = local_10c8;
            local_1418._12_4_ = fStack_142c;
            local_1418._0_12_ = auVar25;
            args.valid = (int *)local_1418;
            args.geometryUserPtr = pGVar10->userPtr;
            args.hit = (RTCHitN *)&local_1148;
            args.N = 4;
            p_Var37 = pGVar10->intersectionFilterN;
            args.ray = (RTCRayN *)ray;
            if (p_Var37 != (RTCFilterFunctionN)0x0) {
              p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&args);
              uVar39 = CONCAT44(fStack_1404,local_1408);
            }
            auVar92._0_4_ = -(uint)(local_1418._0_4_ == 0);
            auVar92._4_4_ = -(uint)(local_1418._4_4_ == 0);
            auVar92._8_4_ = -(uint)(local_1418._8_4_ == 0);
            auVar92._12_4_ = -(uint)(local_1418._12_4_ == 0);
            uVar129 = movmskps((int)p_Var37,auVar92);
            pRVar36 = (RTCRayN *)(ulong)(uVar129 ^ 0xf);
            if ((uVar129 ^ 0xf) == 0) {
              auVar92 = auVar92 ^ _DAT_01f46b70;
            }
            else {
              p_Var37 = context->args->filter;
              if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&args);
                uVar39 = CONCAT44(fStack_1404,local_1408);
              }
              auVar75._0_4_ = -(uint)(local_1418._0_4_ == 0);
              auVar75._4_4_ = -(uint)(local_1418._4_4_ == 0);
              auVar75._8_4_ = -(uint)(local_1418._8_4_ == 0);
              auVar75._12_4_ = -(uint)(local_1418._12_4_ == 0);
              auVar92 = auVar75 ^ _DAT_01f46b70;
              uVar129 = movmskps((int)p_Var37,auVar75);
              pRVar36 = (RTCRayN *)(ulong)(uVar129 ^ 0xf);
              if ((uVar129 ^ 0xf) != 0) {
                auVar116._0_4_ = *(uint *)(args.ray + 0xc0) & auVar75._0_4_;
                auVar116._4_4_ = *(uint *)(args.ray + 0xc4) & auVar75._4_4_;
                auVar116._8_4_ = *(uint *)(args.ray + 200) & auVar75._8_4_;
                auVar116._12_4_ = *(uint *)(args.ray + 0xcc) & auVar75._12_4_;
                auVar172._0_4_ = ~auVar75._0_4_ & *(uint *)args.hit;
                auVar172._4_4_ = ~auVar75._4_4_ & *(uint *)(args.hit + 4);
                auVar172._8_4_ = ~auVar75._8_4_ & *(uint *)(args.hit + 8);
                auVar172._12_4_ = ~auVar75._12_4_ & *(uint *)(args.hit + 0xc);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar172 | auVar116;
                uVar129 = *(uint *)(args.hit + 0x14);
                uVar145 = *(uint *)(args.hit + 0x18);
                uVar146 = *(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0xd0) =
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x10) |
                     *(uint *)(args.ray + 0xd0) & auVar75._0_4_;
                *(uint *)(args.ray + 0xd4) =
                     ~auVar75._4_4_ & uVar129 | *(uint *)(args.ray + 0xd4) & auVar75._4_4_;
                *(uint *)(args.ray + 0xd8) =
                     ~auVar75._8_4_ & uVar145 | *(uint *)(args.ray + 0xd8) & auVar75._8_4_;
                *(uint *)(args.ray + 0xdc) =
                     ~auVar75._12_4_ & uVar146 | *(uint *)(args.ray + 0xdc) & auVar75._12_4_;
                uVar129 = *(uint *)(args.hit + 0x24);
                uVar145 = *(uint *)(args.hit + 0x28);
                uVar146 = *(uint *)(args.hit + 0x2c);
                *(uint *)(args.ray + 0xe0) =
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x20) |
                     *(uint *)(args.ray + 0xe0) & auVar75._0_4_;
                *(uint *)(args.ray + 0xe4) =
                     ~auVar75._4_4_ & uVar129 | *(uint *)(args.ray + 0xe4) & auVar75._4_4_;
                *(uint *)(args.ray + 0xe8) =
                     ~auVar75._8_4_ & uVar145 | *(uint *)(args.ray + 0xe8) & auVar75._8_4_;
                *(uint *)(args.ray + 0xec) =
                     ~auVar75._12_4_ & uVar146 | *(uint *)(args.ray + 0xec) & auVar75._12_4_;
                uVar129 = *(uint *)(args.hit + 0x34);
                uVar145 = *(uint *)(args.hit + 0x38);
                uVar146 = *(uint *)(args.hit + 0x3c);
                *(uint *)(args.ray + 0xf0) =
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x30) |
                     *(uint *)(args.ray + 0xf0) & auVar75._0_4_;
                *(uint *)(args.ray + 0xf4) =
                     ~auVar75._4_4_ & uVar129 | *(uint *)(args.ray + 0xf4) & auVar75._4_4_;
                *(uint *)(args.ray + 0xf8) =
                     ~auVar75._8_4_ & uVar145 | *(uint *)(args.ray + 0xf8) & auVar75._8_4_;
                *(uint *)(args.ray + 0xfc) =
                     ~auVar75._12_4_ & uVar146 | *(uint *)(args.ray + 0xfc) & auVar75._12_4_;
                uVar129 = *(uint *)(args.hit + 0x44);
                uVar145 = *(uint *)(args.hit + 0x48);
                uVar146 = *(uint *)(args.hit + 0x4c);
                *(uint *)(args.ray + 0x100) =
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x40) |
                     *(uint *)(args.ray + 0x100) & auVar75._0_4_;
                *(uint *)(args.ray + 0x104) =
                     ~auVar75._4_4_ & uVar129 | *(uint *)(args.ray + 0x104) & auVar75._4_4_;
                *(uint *)(args.ray + 0x108) =
                     ~auVar75._8_4_ & uVar145 | *(uint *)(args.ray + 0x108) & auVar75._8_4_;
                *(uint *)(args.ray + 0x10c) =
                     ~auVar75._12_4_ & uVar146 | *(uint *)(args.ray + 0x10c) & auVar75._12_4_;
                uVar129 = *(uint *)(args.hit + 0x54);
                uVar145 = *(uint *)(args.hit + 0x58);
                uVar146 = *(uint *)(args.hit + 0x5c);
                *(uint *)(args.ray + 0x110) =
                     *(uint *)(args.ray + 0x110) & auVar75._0_4_ |
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x50);
                *(uint *)(args.ray + 0x114) =
                     *(uint *)(args.ray + 0x114) & auVar75._4_4_ | ~auVar75._4_4_ & uVar129;
                *(uint *)(args.ray + 0x118) =
                     *(uint *)(args.ray + 0x118) & auVar75._8_4_ | ~auVar75._8_4_ & uVar145;
                *(uint *)(args.ray + 0x11c) =
                     *(uint *)(args.ray + 0x11c) & auVar75._12_4_ | ~auVar75._12_4_ & uVar146;
                uVar129 = *(uint *)(args.hit + 100);
                uVar145 = *(uint *)(args.hit + 0x68);
                uVar146 = *(uint *)(args.hit + 0x6c);
                *(uint *)(args.ray + 0x120) =
                     *(uint *)(args.ray + 0x120) & auVar75._0_4_ |
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x60);
                *(uint *)(args.ray + 0x124) =
                     *(uint *)(args.ray + 0x124) & auVar75._4_4_ | ~auVar75._4_4_ & uVar129;
                *(uint *)(args.ray + 0x128) =
                     *(uint *)(args.ray + 0x128) & auVar75._8_4_ | ~auVar75._8_4_ & uVar145;
                *(uint *)(args.ray + 300) =
                     *(uint *)(args.ray + 300) & auVar75._12_4_ | ~auVar75._12_4_ & uVar146;
                uVar129 = *(uint *)(args.hit + 0x74);
                uVar145 = *(uint *)(args.hit + 0x78);
                uVar146 = *(uint *)(args.hit + 0x7c);
                *(uint *)(args.ray + 0x130) =
                     ~auVar75._0_4_ & *(uint *)(args.hit + 0x70) |
                     *(uint *)(args.ray + 0x130) & auVar75._0_4_;
                *(uint *)(args.ray + 0x134) =
                     ~auVar75._4_4_ & uVar129 | *(uint *)(args.ray + 0x134) & auVar75._4_4_;
                *(uint *)(args.ray + 0x138) =
                     ~auVar75._8_4_ & uVar145 | *(uint *)(args.ray + 0x138) & auVar75._8_4_;
                *(uint *)(args.ray + 0x13c) =
                     ~auVar75._12_4_ & uVar146 | *(uint *)(args.ray + 0x13c) & auVar75._12_4_;
                *(undefined1 (*) [16])(args.ray + 0x140) =
                     ~auVar75 & *(undefined1 (*) [16])(args.hit + 0x80) |
                     *(undefined1 (*) [16])(args.ray + 0x140) & auVar75;
                pRVar36 = args.ray;
              }
            }
            auVar93._0_4_ = auVar92._0_4_ << 0x1f;
            auVar93._4_4_ = auVar92._4_4_ << 0x1f;
            auVar93._8_4_ = auVar92._8_4_ << 0x1f;
            auVar93._12_4_ = auVar92._12_4_ << 0x1f;
            iVar38 = movmskps((int)pRVar36,auVar93);
            if (iVar38 == 0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1488._0_4_;
            }
            else {
              local_1488._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
              local_1488._4_4_ = 0;
              fStack_1480 = 0.0;
              fStack_147c = 0.0;
            }
            *(undefined4 *)(local_1418 + lVar34 * 4 + -0x10) = 0;
            valid.field_0.i[0] = -(uint)(fVar188 <= (float)local_1488._0_4_) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar164 <= (float)local_1488._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar165 <= (float)local_1488._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar167 <= (float)local_1488._0_4_) & valid.field_0.i[3];
            iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
            if (iVar38 == 0) break;
            auVar94._0_4_ = valid.field_0.i[0] & (uint)fVar188;
            auVar94._4_4_ = valid.field_0.i[1] & (uint)fVar164;
            auVar94._8_4_ = valid.field_0.i[2] & (uint)fVar165;
            auVar94._12_4_ = valid.field_0.i[3] & (uint)fVar167;
            auVar117._0_8_ = CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
            auVar117._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
            auVar117._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
            auVar117 = auVar117 | auVar94;
            auVar138._4_4_ = auVar117._0_4_;
            auVar138._0_4_ = auVar117._4_4_;
            auVar138._8_4_ = auVar117._12_4_;
            auVar138._12_4_ = auVar117._8_4_;
            auVar111 = minps(auVar138,auVar117);
            auVar95._0_8_ = auVar111._8_8_;
            auVar95._8_4_ = auVar111._0_4_;
            auVar95._12_4_ = auVar111._4_4_;
            auVar111 = minps(auVar95,auVar111);
            auVar96._0_8_ =
                 CONCAT44(-(uint)(auVar111._4_4_ == auVar117._4_4_) & valid.field_0.i[1],
                          -(uint)(auVar111._0_4_ == auVar117._0_4_) & valid.field_0.i[0]);
            auVar96._8_4_ = -(uint)(auVar111._8_4_ == auVar117._8_4_) & valid.field_0.i[2];
            auVar96._12_4_ = -(uint)(auVar111._12_4_ == auVar117._12_4_) & valid.field_0.i[3];
            iVar38 = movmskps(iVar38,auVar96);
            aVar76 = valid.field_0;
            if (iVar38 != 0) {
              aVar76.i[2] = auVar96._8_4_;
              aVar76._0_8_ = auVar96._0_8_;
              aVar76.i[3] = auVar96._12_4_;
            }
            uVar30 = movmskps(iVar38,(undefined1  [16])aVar76);
            uVar41 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar30);
            lVar34 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
          }
          fVar229 = *(float *)(ray + k * 4 + 0x10);
          fVar255 = *(float *)(ray + k * 4 + 0x20);
          fStack_13fc = *(float *)(ray + k * 4 + 0x40);
          local_1488._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
          fStack_148c = *(float *)(ray + k * 4 + 0x60);
          local_1438 = local_1058 - fVar229;
          fStack_1434 = fStack_1054 - fVar229;
          fStack_1430 = fStack_1050 - fVar229;
          fStack_142c = fStack_104c - fVar229;
          local_1478 = (float)local_1038 - fVar255;
          fStack_1474 = local_1038._4_4_ - fVar255;
          fStack_1470 = fStack_1030 - fVar255;
          fStack_146c = fStack_102c - fVar255;
          fVar179 = local_1048 - fVar229;
          fVar153 = fStack_1044 - fVar229;
          fVar154 = fStack_1040 - fVar229;
          fVar155 = fStack_103c - fVar229;
          fVar244 = fVar198 - fVar255;
          fVar247 = fVar234 - fVar255;
          fVar250 = fStack_1350 - fVar255;
          fVar252 = fStack_134c - fVar255;
          local_1368 = local_1438 + fVar179;
          fStack_1364 = fStack_1434 + fVar153;
          fStack_1360 = fStack_1430 + fVar154;
          fStack_135c = fStack_142c + fVar155;
          fStack_1444 = fStack_1474 + fVar247;
          local_1448 = local_1478 + fVar244;
          fStack_1440 = fStack_1470 + fVar250;
          fStack_143c = fStack_146c + fVar252;
          uVar29 = 0;
        }
        local_1488._0_4_ = local_1488._4_4_;
        fStack_1480 = (float)local_1488._4_4_;
        fStack_147c = (float)local_1488._4_4_;
      }
      fVar256 = fVar166 - fVar255;
      fVar230 = fVar230 - fVar255;
      fStack_14a0 = fStack_14a0 - fVar255;
      fStack_149c = fStack_149c - fVar255;
      fVar168 = fVar168 - fVar229;
      fVar176 = fVar176 - fVar229;
      fVar177 = fVar177 - fVar229;
      fVar178 = fVar178 - fVar229;
      fVar106 = *(float *)(ray + k * 4);
      fVar180 = fVar180 - fVar106;
      fVar187 = fVar187 - fVar106;
      fStack_1450 = fStack_1450 - fVar106;
      fStack_144c = fStack_144c - fVar106;
      fVar198 = (float)local_1248 - fVar106;
      fVar234 = local_1248._4_4_ - fVar106;
      fVar243 = fStack_1240 - fVar106;
      fVar229 = fStack_123c - fVar106;
      fVar255 = local_1238 - fVar106;
      fVar157 = fStack_1234 - fVar106;
      fVar164 = fStack_1230 - fVar106;
      fVar106 = fStack_122c - fVar106;
      fVar227 = fVar255 - fVar180;
      fVar228 = fVar157 - fVar187;
      fStack_1350 = fVar164 - fStack_1450;
      fStack_134c = fVar106 - fStack_144c;
      fVar196 = fVar179 - fVar168;
      fVar219 = fVar153 - fVar176;
      fStack_1240 = fVar154 - fVar177;
      fStack_123c = fVar155 - fVar178;
      fVar245 = fVar244 - fVar256;
      fVar248 = fVar247 - fVar230;
      fStack_1230 = fVar250 - fStack_14a0;
      fStack_122c = fVar252 - fStack_149c;
      fVar156 = local_1438 - fVar179;
      fVar185 = fStack_1434 - fVar153;
      fVar186 = fStack_1430 - fVar154;
      fVar193 = fStack_142c - fVar155;
      fVar258 = local_1478 - fVar244;
      fVar231 = fStack_1474 - fVar247;
      fVar232 = fStack_1470 - fVar250;
      fVar233 = fStack_146c - fVar252;
      _local_1238 = CONCAT44(fVar248,fVar245);
      fVar246 = fVar180 - fVar198;
      fVar249 = fVar187 - fVar234;
      fVar251 = fStack_1450 - fVar243;
      fVar253 = fStack_144c - fVar229;
      local_1248 = CONCAT44(fVar219,fVar196);
      fVar235 = fVar168 - local_1438;
      fVar237 = fVar176 - fStack_1434;
      fVar239 = fVar177 - fStack_1430;
      fVar241 = fVar178 - fStack_142c;
      fVar197 = fVar256 - local_1478;
      fVar220 = fVar230 - fStack_1474;
      fVar225 = fStack_14a0 - fStack_1470;
      fVar226 = fStack_149c - fStack_146c;
      fVar236 = (fVar196 * (fVar244 + fVar256) - (fVar179 + fVar168) * fVar245) * fStack_13fc +
                ((fVar255 + fVar180) * fVar245 - (fVar244 + fVar256) * fVar227) *
                (float)local_1488._0_4_ +
                (fVar227 * (fVar179 + fVar168) - (fVar255 + fVar180) * fVar196) * fStack_148c;
      fVar238 = (fVar219 * (fVar247 + fVar230) - (fVar153 + fVar176) * fVar248) * fStack_13fc +
                ((fVar157 + fVar187) * fVar248 - (fVar247 + fVar230) * fVar228) *
                (float)local_1488._4_4_ +
                (fVar228 * (fVar153 + fVar176) - (fVar157 + fVar187) * fVar219) * fStack_148c;
      fVar240 = (fStack_1240 * (fVar250 + fStack_14a0) - (fVar154 + fVar177) * fStack_1230) *
                fStack_13fc +
                ((fVar164 + fStack_1450) * fStack_1230 - (fVar250 + fStack_14a0) * fStack_1350) *
                fStack_1480 +
                (fStack_1350 * (fVar154 + fVar177) - (fVar164 + fStack_1450) * fStack_1240) *
                fStack_148c;
      fVar242 = (fStack_123c * (fVar252 + fStack_149c) - (fVar155 + fVar178) * fStack_122c) *
                fStack_13fc +
                ((fVar106 + fStack_144c) * fStack_122c - (fVar252 + fStack_149c) * fStack_134c) *
                fStack_147c +
                (fStack_134c * (fVar155 + fVar178) - (fVar106 + fStack_144c) * fStack_123c) *
                fStack_148c;
      fVar247 = fVar198 - fVar255;
      fVar250 = fVar234 - fVar157;
      fVar252 = fVar243 - fVar164;
      fVar179 = fVar229 - fVar106;
      local_1258._0_4_ =
           (fVar235 * (local_1478 + fVar256) - (local_1438 + fVar168) * fVar197) * fStack_13fc +
           ((fVar180 + fVar198) * fVar197 - (local_1478 + fVar256) * fVar246) *
           (float)local_1488._0_4_ +
           (fVar246 * (local_1438 + fVar168) - (fVar180 + fVar198) * fVar235) * fStack_148c;
      local_1258._4_4_ =
           (fVar237 * (fStack_1474 + fVar230) - (fStack_1434 + fVar176) * fVar220) * fStack_13fc +
           ((fVar187 + fVar234) * fVar220 - (fStack_1474 + fVar230) * fVar249) *
           (float)local_1488._4_4_ +
           (fVar249 * (fStack_1434 + fVar176) - (fVar187 + fVar234) * fVar237) * fStack_148c;
      local_1258._8_4_ =
           (fVar239 * (fStack_1470 + fStack_14a0) - (fStack_1430 + fVar177) * fVar225) * fStack_13fc
           + ((fStack_1450 + fVar243) * fVar225 - (fStack_1470 + fStack_14a0) * fVar251) *
             fStack_1480 +
             (fVar251 * (fStack_1430 + fVar177) - (fStack_1450 + fVar243) * fVar239) * fStack_148c;
      local_1258._12_4_ =
           (fVar241 * (fStack_146c + fStack_149c) - (fStack_142c + fVar178) * fVar226) * fStack_13fc
           + ((fStack_144c + fVar229) * fVar226 - (fStack_146c + fStack_149c) * fVar253) *
             fStack_147c +
             (fVar253 * (fStack_142c + fVar178) - (fStack_144c + fVar229) * fVar241) * fStack_148c;
      auVar97._0_4_ =
           (fVar156 * local_1448 - local_1368 * fVar258) * fStack_13fc +
           ((fVar255 + fVar198) * fVar258 - local_1448 * fVar247) * (float)local_1488._0_4_ +
           (fVar247 * local_1368 - (fVar255 + fVar198) * fVar156) * fStack_148c;
      auVar97._4_4_ =
           (fVar185 * fStack_1444 - fStack_1364 * fVar231) * fStack_13fc +
           ((fVar157 + fVar234) * fVar231 - fStack_1444 * fVar250) * (float)local_1488._4_4_ +
           (fVar250 * fStack_1364 - (fVar157 + fVar234) * fVar185) * fStack_148c;
      auVar97._8_4_ =
           (fVar186 * fStack_1440 - fStack_1360 * fVar232) * fStack_13fc +
           ((fVar164 + fVar243) * fVar232 - fStack_1440 * fVar252) * fStack_1480 +
           (fVar252 * fStack_1360 - (fVar164 + fVar243) * fVar186) * fStack_148c;
      auVar97._12_4_ =
           (fVar193 * fStack_143c - fStack_135c * fVar233) * fStack_13fc +
           ((fVar106 + fVar229) * fVar233 - fStack_143c * fVar179) * fStack_147c +
           (fVar179 * fStack_135c - (fVar106 + fVar229) * fVar193) * fStack_148c;
      auVar151._0_4_ = fVar236 + local_1258._0_4_ + auVar97._0_4_;
      auVar151._4_4_ = fVar238 + local_1258._4_4_ + auVar97._4_4_;
      auVar151._8_4_ = fVar240 + local_1258._8_4_ + auVar97._8_4_;
      auVar151._12_4_ = fVar242 + local_1258._12_4_ + auVar97._12_4_;
      uVar41 = CONCAT44(auVar151._4_4_,auVar151._0_4_);
      local_1268 = (undefined1  [8])(uVar41 & 0x7fffffff7fffffff);
      fStack_1260 = ABS(auVar151._8_4_);
      fStack_125c = ABS(auVar151._12_4_);
      auVar118._4_4_ = fVar238;
      auVar118._0_4_ = fVar236;
      auVar118._8_4_ = fVar240;
      auVar118._12_4_ = fVar242;
      auVar111 = minps(auVar118,local_1258);
      auVar68 = minps(auVar111,auVar97);
      auVar77._4_4_ = fVar238;
      auVar77._0_4_ = fVar236;
      auVar77._8_4_ = fVar240;
      auVar77._12_4_ = fVar242;
      auVar111 = maxps(auVar77,local_1258);
      auVar88 = maxps(auVar111,auVar97);
      auVar111 = _local_1268;
      auVar78._4_4_ = -(uint)(auVar88._4_4_ <= ABS(auVar151._4_4_) * 1.1920929e-07);
      auVar78._0_4_ = -(uint)(auVar88._0_4_ <= ABS(auVar151._0_4_) * 1.1920929e-07);
      auVar78._8_4_ = -(uint)(auVar88._8_4_ <= fStack_1260 * 1.1920929e-07);
      auVar78._12_4_ = -(uint)(auVar88._12_4_ <= fStack_125c * 1.1920929e-07);
      auVar119._4_4_ = -(uint)(-(ABS(auVar151._4_4_) * 1.1920929e-07) <= auVar68._4_4_);
      auVar119._0_4_ = -(uint)(-(ABS(auVar151._0_4_) * 1.1920929e-07) <= auVar68._0_4_);
      auVar119._8_4_ = -(uint)(-(fStack_1260 * 1.1920929e-07) <= auVar68._8_4_);
      auVar119._12_4_ = -(uint)(-(fStack_125c * 1.1920929e-07) <= auVar68._12_4_);
      auVar78 = auVar78 | auVar119;
      iVar38 = movmskps(uVar29,auVar78);
      uVar41 = local_11c0;
      uVar43 = local_11c8;
      uVar45 = local_11d0;
      uVar46 = local_11d8;
      uVar47 = local_11e0;
      fVar234 = local_1078;
      fVar229 = fStack_1074;
      fVar255 = fStack_1070;
      fVar244 = fStack_106c;
      auVar68 = local_1278;
      fVar198 = local_1068;
      fVar153 = fStack_1064;
      fVar154 = fStack_1060;
      fVar155 = fStack_105c;
      fVar243 = local_1088;
      fVar157 = fStack_1084;
      fVar164 = fStack_1080;
      fVar165 = fStack_107c;
      fVar254 = local_1098;
      fVar167 = fStack_1094;
      fVar188 = fStack_1090;
      fVar192 = fStack_108c;
      if (iVar38 != 0) {
        uVar29 = -(uint)(ABS(fVar156 * fVar197) <= ABS(fVar235 * fVar245));
        uVar146 = -(uint)(ABS(fVar185 * fVar220) <= ABS(fVar237 * fVar248));
        uVar50 = -(uint)(ABS(fVar186 * fVar225) <= ABS(fVar239 * fStack_1230));
        uVar53 = -(uint)(ABS(fVar193 * fVar226) <= ABS(fVar241 * fStack_122c));
        uVar129 = -(uint)(ABS(fVar246 * fVar258) <= ABS(fVar227 * fVar197));
        uVar147 = -(uint)(ABS(fVar249 * fVar231) <= ABS(fVar228 * fVar220));
        uVar51 = -(uint)(ABS(fVar251 * fVar232) <= ABS(fStack_1350 * fVar225));
        uVar55 = -(uint)(ABS(fVar253 * fVar233) <= ABS(fStack_134c * fVar226));
        uVar145 = -(uint)(ABS(fVar247 * fVar235) <= ABS(fVar246 * fVar196));
        uVar49 = -(uint)(ABS(fVar250 * fVar237) <= ABS(fVar249 * fVar219));
        uVar52 = -(uint)(ABS(fVar252 * fVar239) <= ABS(fVar251 * fStack_1240));
        uVar56 = -(uint)(ABS(fVar179 * fVar241) <= ABS(fVar253 * fStack_123c));
        auVar190._0_4_ = (uint)(fVar235 * fVar258 - fVar156 * fVar197) & uVar29;
        auVar190._4_4_ = (uint)(fVar237 * fVar231 - fVar185 * fVar220) & uVar146;
        auVar190._8_4_ = (uint)(fVar239 * fVar232 - fVar186 * fVar225) & uVar50;
        auVar190._12_4_ = (uint)(fVar241 * fVar233 - fVar193 * fVar226) & uVar53;
        auVar257._0_4_ = ~uVar29 & (uint)(fVar196 * fVar197 - fVar235 * fVar245);
        auVar257._4_4_ = ~uVar146 & (uint)(fVar219 * fVar220 - fVar237 * fVar248);
        auVar257._8_4_ = ~uVar50 & (uint)(fStack_1240 * fVar225 - fVar239 * fStack_1230);
        auVar257._12_4_ = ~uVar53 & (uint)(fStack_123c * fVar226 - fVar241 * fStack_122c);
        _local_12b8 = auVar257 | auVar190;
        auVar139._0_4_ = (uint)(fVar247 * fVar197 - fVar246 * fVar258) & uVar129;
        auVar139._4_4_ = (uint)(fVar250 * fVar220 - fVar249 * fVar231) & uVar147;
        auVar139._8_4_ = (uint)(fVar252 * fVar225 - fVar251 * fVar232) & uVar51;
        auVar139._12_4_ = (uint)(fVar179 * fVar226 - fVar253 * fVar233) & uVar55;
        auVar212._0_4_ = ~uVar129 & (uint)(fVar245 * fVar246 - fVar227 * fVar197);
        auVar212._4_4_ = ~uVar147 & (uint)(fVar248 * fVar249 - fVar228 * fVar220);
        auVar212._8_4_ = ~uVar51 & (uint)(fStack_1230 * fVar251 - fStack_1350 * fVar225);
        auVar212._12_4_ = ~uVar55 & (uint)(fStack_122c * fVar253 - fStack_134c * fVar226);
        _local_12a8 = auVar212 | auVar139;
        local_1298[0] =
             (float)(~uVar145 & (uint)(fVar227 * fVar235 - fVar246 * fVar196) |
                    (uint)(fVar246 * fVar156 - fVar247 * fVar235) & uVar145);
        local_1298[1] =
             (float)(~uVar49 & (uint)(fVar228 * fVar237 - fVar249 * fVar219) |
                    (uint)(fVar249 * fVar185 - fVar250 * fVar237) & uVar49);
        local_1298[2] =
             (float)(~uVar52 & (uint)(fStack_1350 * fVar239 - fVar251 * fStack_1240) |
                    (uint)(fVar251 * fVar186 - fVar252 * fVar239) & uVar52);
        local_1298[3] =
             (float)(~uVar56 & (uint)(fStack_134c * fVar241 - fVar253 * fStack_123c) |
                    (uint)(fVar253 * fVar193 - fVar179 * fVar241) & uVar56);
        fVar106 = fStack_13fc * local_12b8._0_4_ +
                  (float)local_1488._0_4_ * local_12a8._0_4_ + fStack_148c * local_1298[0];
        fVar156 = fStack_13fc * local_12b8._4_4_ +
                  (float)local_1488._4_4_ * local_12a8._4_4_ + fStack_148c * local_1298[1];
        fVar247 = fStack_13fc * local_12b8._8_4_ +
                  fStack_1480 * local_12a8._8_4_ + fStack_148c * local_1298[2];
        fVar250 = fStack_13fc * local_12b8._12_4_ +
                  fStack_147c * local_12a8._12_4_ + fStack_148c * local_1298[3];
        auVar161._0_4_ = fVar106 + fVar106;
        auVar161._4_4_ = fVar156 + fVar156;
        auVar161._8_4_ = fVar247 + fVar247;
        auVar161._12_4_ = fVar250 + fVar250;
        auVar98._0_4_ = fVar168 * local_12a8._0_4_ + fVar256 * local_1298[0];
        auVar98._4_4_ = fVar176 * local_12a8._4_4_ + fVar230 * local_1298[1];
        auVar98._8_4_ = fVar177 * local_12a8._8_4_ + fStack_14a0 * local_1298[2];
        auVar98._12_4_ = fVar178 * local_12a8._12_4_ + fStack_149c * local_1298[3];
        fVar176 = fVar180 * local_12b8._0_4_ + auVar98._0_4_;
        fVar187 = fVar187 * local_12b8._4_4_ + auVar98._4_4_;
        fVar230 = fStack_1450 * local_12b8._8_4_ + auVar98._8_4_;
        fVar178 = fStack_144c * local_12b8._12_4_ + auVar98._12_4_;
        auVar88 = rcpps(auVar98,auVar161);
        fVar106 = auVar88._0_4_;
        fVar156 = auVar88._4_4_;
        fVar180 = auVar88._8_4_;
        fVar168 = auVar88._12_4_;
        auVar120._0_4_ =
             ((1.0 - auVar161._0_4_ * fVar106) * fVar106 + fVar106) * (fVar176 + fVar176);
        auVar120._4_4_ =
             ((1.0 - auVar161._4_4_ * fVar156) * fVar156 + fVar156) * (fVar187 + fVar187);
        auVar120._8_4_ =
             ((1.0 - auVar161._8_4_ * fVar180) * fVar180 + fVar180) * (fVar230 + fVar230);
        auVar120._12_4_ =
             ((1.0 - auVar161._12_4_ * fVar168) * fVar168 + fVar168) * (fVar178 + fVar178);
        fVar156 = *(float *)(ray + k * 4 + 0x80);
        fVar106 = *(float *)(ray + k * 4 + 0x30);
        iVar54 = -(uint)(fVar106 <= auVar120._4_4_);
        iVar58 = -(uint)(fVar106 <= auVar120._8_4_);
        iVar62 = -(uint)(fVar106 <= auVar120._12_4_);
        auVar140._8_4_ = iVar58;
        auVar140._4_4_ = iVar54;
        auVar140._12_4_ = iVar62;
        auVar99._0_4_ =
             -(uint)(auVar120._0_4_ <= fVar156 && fVar106 <= auVar120._0_4_) & auVar78._0_4_;
        auVar99._4_4_ =
             -(uint)(auVar120._4_4_ <= fVar156 && fVar106 <= auVar120._4_4_) & auVar78._4_4_;
        auVar99._8_4_ =
             -(uint)(auVar120._8_4_ <= fVar156 && fVar106 <= auVar120._8_4_) & auVar78._8_4_;
        auVar99._12_4_ =
             -(uint)(auVar120._12_4_ <= fVar156 && fVar106 <= auVar120._12_4_) & auVar78._12_4_;
        iVar38 = movmskps(iVar38,auVar99);
        if (iVar38 != 0) {
          valid.field_0.i[0] = auVar99._0_4_ & -(uint)(auVar161._0_4_ != 0.0);
          valid.field_0.i[1] = auVar99._4_4_ & -(uint)(auVar161._4_4_ != 0.0);
          valid.field_0.i[2] = auVar99._8_4_ & -(uint)(auVar161._8_4_ != 0.0);
          valid.field_0.i[3] = auVar99._12_4_ & -(uint)(auVar161._12_4_ != 0.0);
          iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
          if (iVar38 != 0) {
            _local_12c8 = auVar120;
            auVar162._0_4_ = auVar151._0_4_ - local_1258._0_4_;
            auVar162._4_4_ = auVar151._4_4_ - local_1258._4_4_;
            auVar162._8_4_ = auVar151._8_4_ - local_1258._8_4_;
            auVar162._12_4_ = auVar151._12_4_ - local_1258._12_4_;
            auVar140._0_4_ = (float)(int)(*(ushort *)(lVar11 + 8 + lVar42) - 1);
            auVar173._4_4_ = iVar54;
            auVar173._0_4_ = auVar140._0_4_;
            auVar173._8_4_ = iVar58;
            auVar173._12_4_ = iVar62;
            auVar88 = rcpss(auVar173,auVar140);
            fVar106 = (2.0 - auVar140._0_4_ * auVar88._0_4_) * auVar88._0_4_;
            auVar174._4_12_ = auVar88._4_12_;
            auVar174._0_4_ = (float)(int)(*(ushort *)(lVar11 + 10 + lVar42) - 1);
            auVar191._4_4_ = auVar88._4_4_;
            auVar191._0_4_ = auVar174._0_4_;
            auVar191._8_4_ = auVar88._8_4_;
            auVar191._12_4_ = auVar88._12_4_;
            auVar88 = rcpss(auVar191,auVar174);
            fVar180 = (2.0 - auVar174._0_4_ * auVar88._0_4_) * auVar88._0_4_;
            tNear.field_0.v[0] =
                 fVar106 * ((float)sx.field_0.i[0] * auVar151._0_4_ + (auVar151._0_4_ - fVar236));
            tNear.field_0.v[1] =
                 fVar106 * ((float)(sx.field_0.i[1] + 1) * auVar151._4_4_ +
                           (auVar151._4_4_ - fVar238));
            tNear.field_0.v[2] =
                 fVar106 * ((float)(sx.field_0.i[2] + 1) * auVar151._8_4_ +
                           (auVar151._8_4_ - fVar240));
            tNear.field_0.v[3] =
                 fVar106 * ((float)sx.field_0.i[3] * auVar151._12_4_ + (auVar151._12_4_ - fVar242));
            pGVar10 = (context->scene->geometries).items[uVar39].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar88 = rcpps(auVar162,auVar151);
              fVar106 = auVar88._0_4_;
              fVar168 = auVar88._4_4_;
              fVar187 = auVar88._8_4_;
              fVar176 = auVar88._12_4_;
              local_1268._4_4_ = (undefined4)((ulong)local_1268 >> 0x20);
              fVar106 = (float)(-(uint)(1e-18 <= (float)local_1268._0_4_) &
                               (uint)(((float)DAT_01f46a60 - auVar151._0_4_ * fVar106) * fVar106 +
                                     fVar106));
              fVar168 = (float)(-(uint)(1e-18 <= (float)local_1268._4_4_) &
                               (uint)((DAT_01f46a60._4_4_ - auVar151._4_4_ * fVar168) * fVar168 +
                                     fVar168));
              fVar187 = (float)(-(uint)(1e-18 <= fStack_1260) &
                               (uint)((DAT_01f46a60._8_4_ - auVar151._8_4_ * fVar187) * fVar187 +
                                     fVar187));
              fVar176 = (float)(-(uint)(1e-18 <= fStack_125c) &
                               (uint)((DAT_01f46a60._12_4_ - auVar151._12_4_ * fVar176) * fVar176 +
                                     fVar176));
              auVar79._0_4_ = tNear.field_0.v[0] * fVar106;
              auVar79._4_4_ = tNear.field_0.v[1] * fVar168;
              auVar79._8_4_ = tNear.field_0.v[2] * fVar187;
              auVar79._12_4_ = tNear.field_0.v[3] * fVar176;
              local_12e8 = minps(auVar79,_DAT_01f46a60);
              auVar141._0_4_ =
                   fVar180 * ((float)(int)fVar166 * auVar151._0_4_ + auVar162._0_4_) * fVar106;
              auVar141._4_4_ =
                   fVar180 * ((float)(int)fVar166 * auVar151._4_4_ + auVar162._4_4_) * fVar168;
              auVar141._8_4_ =
                   fVar180 * ((float)((int)fVar166 + 1) * auVar151._8_4_ + auVar162._8_4_) * fVar187
              ;
              auVar141._12_4_ =
                   fVar180 * ((float)((int)fVar166 + 1) * auVar151._12_4_ + auVar162._12_4_) *
                   fVar176;
              local_12d8 = minps(auVar141,_DAT_01f46a60);
              auVar121._0_4_ = (uint)auVar120._0_4_ & valid.field_0.i[0];
              auVar121._4_4_ = (uint)auVar120._4_4_ & valid.field_0.i[1];
              auVar121._8_4_ = (uint)auVar120._8_4_ & valid.field_0.i[2];
              auVar121._12_4_ = (uint)auVar120._12_4_ & valid.field_0.i[3];
              auVar142._0_8_ =
                   CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
              auVar142._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
              auVar142._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
              auVar142 = auVar142 | auVar121;
              auVar122._4_4_ = auVar142._0_4_;
              auVar122._0_4_ = auVar142._4_4_;
              auVar122._8_4_ = auVar142._12_4_;
              auVar122._12_4_ = auVar142._8_4_;
              auVar88 = minps(auVar122,auVar142);
              auVar80._0_8_ = auVar88._8_8_;
              auVar80._8_4_ = auVar88._0_4_;
              auVar80._12_4_ = auVar88._4_4_;
              auVar88 = minps(auVar80,auVar88);
              uVar147 = -(uint)(auVar88._0_4_ == auVar142._0_4_);
              uVar49 = -(uint)(auVar88._4_4_ == auVar142._4_4_);
              uVar50 = -(uint)(auVar88._8_4_ == auVar142._8_4_);
              uVar51 = -(uint)(auVar88._12_4_ == auVar142._12_4_);
              auVar123._0_4_ = uVar147 & valid.field_0.i[0];
              auVar123._4_4_ = uVar49 & valid.field_0.i[1];
              auVar123._8_4_ = uVar50 & valid.field_0.i[2];
              auVar123._12_4_ = uVar51 & valid.field_0.i[3];
              iVar38 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar123);
              uVar29 = 0xffffffff;
              uVar129 = 0xffffffff;
              uVar145 = 0xffffffff;
              uVar146 = 0xffffffff;
              if (iVar38 != 0) {
                uVar29 = uVar147;
                uVar129 = uVar49;
                uVar145 = uVar50;
                uVar146 = uVar51;
              }
              auVar100._0_4_ = valid.field_0.i[0] & uVar29;
              auVar100._4_4_ = valid.field_0.i[1] & uVar129;
              auVar100._8_4_ = valid.field_0.i[2] & uVar145;
              auVar100._12_4_ = valid.field_0.i[3] & uVar146;
              uVar29 = movmskps(iVar38,auVar100);
              lVar34 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar30 = *(undefined4 *)(local_12e8 + lVar34 * 4);
                uVar6 = *(undefined4 *)(local_12d8 + lVar34 * 4);
                uVar31 = *(undefined4 *)(local_12b8 + lVar34 * 4);
                fVar106 = local_1298[lVar34 + -4];
                fVar156 = local_1298[lVar34];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12c8 + lVar34 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar31;
                *(float *)(ray + k * 4 + 0xd0) = fVar106;
                *(float *)(ray + k * 4 + 0xe0) = fVar156;
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar30;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                *(uint *)(ray + k * 4 + 0x110) = uVar8;
                *(int *)(ray + k * 4 + 0x120) = (int)uVar39;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                uVar6 = local_1168._0_4_;
                uVar30 = local_1178._0_4_;
                local_14a8 = CONCAT44(local_1178._0_4_,local_1178._0_4_);
                fStack_14a0 = (float)local_1178._0_4_;
                fStack_149c = (float)local_1178._0_4_;
                auVar25 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar32);
                fStack_1450 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
                fStack_144c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar32 + 8) >> 0x20)
                ;
                local_1408 = fStack_13fc;
                fStack_1404 = fStack_13fc;
                fStack_1400 = fStack_13fc;
                _local_1268 = auVar111;
                while( true ) {
                  local_1118 = *(undefined4 *)(local_12e8 + lVar34 * 4);
                  uVar31 = *(undefined4 *)(local_12d8 + lVar34 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12c8 + lVar34 * 4);
                  args.context = context->user;
                  local_1108._4_4_ = uVar31;
                  local_1108._0_4_ = uVar31;
                  local_1108._8_4_ = uVar31;
                  local_1108._12_4_ = uVar31;
                  local_1148 = *(undefined4 *)(local_12b8 + lVar34 * 4);
                  fVar106 = local_1298[lVar34 + -4];
                  fVar198 = local_1298[lVar34];
                  local_1138._4_4_ = fVar106;
                  local_1138._0_4_ = fVar106;
                  fStack_1130 = fVar106;
                  fStack_112c = fVar106;
                  local_1128._4_4_ = fVar198;
                  local_1128._0_4_ = fVar198;
                  fStack_1120 = fVar198;
                  fStack_111c = fVar198;
                  uStack_1144 = local_1148;
                  uStack_1140 = local_1148;
                  uStack_113c = local_1148;
                  uStack_1114 = local_1118;
                  uStack_1110 = local_1118;
                  uStack_110c = local_1118;
                  local_10f8 = local_14a8;
                  uStack_10f0 = CONCAT44(uVar30,uVar30);
                  local_10e8 = CONCAT44(uVar6,uVar6);
                  uStack_10e0 = CONCAT44(uVar6,uVar6);
                  local_10d8 = (args.context)->instID[0];
                  uStack_10d4 = local_10d8;
                  uStack_10d0 = local_10d8;
                  uStack_10cc = local_10d8;
                  local_10c8 = (args.context)->instPrimID[0];
                  uStack_10c4 = local_10c8;
                  uStack_10c0 = local_10c8;
                  uStack_10bc = local_10c8;
                  local_1418._12_4_ = fStack_144c;
                  local_1418._0_12_ = auVar25;
                  args.valid = (int *)local_1418;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = (RTCHitN *)&local_1148;
                  args.N = 4;
                  p_Var37 = pGVar10->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var37 != (RTCFilterFunctionN)0x0) {
                    p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&args);
                  }
                  auVar101._0_4_ = -(uint)(local_1418._0_4_ == 0);
                  auVar101._4_4_ = -(uint)(local_1418._4_4_ == 0);
                  auVar101._8_4_ = -(uint)(local_1418._8_4_ == 0);
                  auVar101._12_4_ = -(uint)(local_1418._12_4_ == 0);
                  uVar29 = movmskps((int)p_Var37,auVar101);
                  pRVar36 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                  if ((uVar29 ^ 0xf) == 0) {
                    auVar101 = auVar101 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      p_Var37 = (RTCFilterFunctionN)(*p_Var37)(&args);
                    }
                    auVar81._0_4_ = -(uint)(local_1418._0_4_ == 0);
                    auVar81._4_4_ = -(uint)(local_1418._4_4_ == 0);
                    auVar81._8_4_ = -(uint)(local_1418._8_4_ == 0);
                    auVar81._12_4_ = -(uint)(local_1418._12_4_ == 0);
                    auVar101 = auVar81 ^ _DAT_01f46b70;
                    uVar29 = movmskps((int)p_Var37,auVar81);
                    pRVar36 = (RTCRayN *)(ulong)(uVar29 ^ 0xf);
                    if ((uVar29 ^ 0xf) != 0) {
                      auVar124._0_4_ = *(uint *)(args.ray + 0xc0) & auVar81._0_4_;
                      auVar124._4_4_ = *(uint *)(args.ray + 0xc4) & auVar81._4_4_;
                      auVar124._8_4_ = *(uint *)(args.ray + 200) & auVar81._8_4_;
                      auVar124._12_4_ = *(uint *)(args.ray + 0xcc) & auVar81._12_4_;
                      auVar175._0_4_ = ~auVar81._0_4_ & *(uint *)args.hit;
                      auVar175._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 4);
                      auVar175._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 8);
                      auVar175._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0xc);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar175 | auVar124;
                      uVar29 = *(uint *)(args.hit + 0x14);
                      uVar8 = *(uint *)(args.hit + 0x18);
                      uVar129 = *(uint *)(args.hit + 0x1c);
                      *(uint *)(args.ray + 0xd0) =
                           ~auVar81._0_4_ & *(uint *)(args.hit + 0x10) |
                           *(uint *)(args.ray + 0xd0) & auVar81._0_4_;
                      *(uint *)(args.ray + 0xd4) =
                           ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0xd4) & auVar81._4_4_;
                      *(uint *)(args.ray + 0xd8) =
                           ~auVar81._8_4_ & uVar8 | *(uint *)(args.ray + 0xd8) & auVar81._8_4_;
                      *(uint *)(args.ray + 0xdc) =
                           ~auVar81._12_4_ & uVar129 | *(uint *)(args.ray + 0xdc) & auVar81._12_4_;
                      auVar152._0_4_ = *(uint *)(args.ray + 0xe0) & auVar81._0_4_;
                      auVar152._4_4_ = *(uint *)(args.ray + 0xe4) & auVar81._4_4_;
                      auVar152._8_4_ = *(uint *)(args.ray + 0xe8) & auVar81._8_4_;
                      auVar152._12_4_ = *(uint *)(args.ray + 0xec) & auVar81._12_4_;
                      auVar125._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x20);
                      auVar125._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x24);
                      auVar125._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x28);
                      auVar125._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x2c);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar125 | auVar152;
                      auVar163._0_4_ = *(uint *)(args.ray + 0xf0) & auVar81._0_4_;
                      auVar163._4_4_ = *(uint *)(args.ray + 0xf4) & auVar81._4_4_;
                      auVar163._8_4_ = *(uint *)(args.ray + 0xf8) & auVar81._8_4_;
                      auVar163._12_4_ = *(uint *)(args.ray + 0xfc) & auVar81._12_4_;
                      auVar126._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x30);
                      auVar126._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x34);
                      auVar126._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x38);
                      auVar126._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x3c);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar126 | auVar163;
                      uVar29 = *(uint *)(args.hit + 0x44);
                      uVar8 = *(uint *)(args.hit + 0x48);
                      uVar129 = *(uint *)(args.hit + 0x4c);
                      *(uint *)(args.ray + 0x100) =
                           ~auVar81._0_4_ & *(uint *)(args.hit + 0x40) |
                           *(uint *)(args.ray + 0x100) & auVar81._0_4_;
                      *(uint *)(args.ray + 0x104) =
                           ~auVar81._4_4_ & uVar29 | *(uint *)(args.ray + 0x104) & auVar81._4_4_;
                      *(uint *)(args.ray + 0x108) =
                           ~auVar81._8_4_ & uVar8 | *(uint *)(args.ray + 0x108) & auVar81._8_4_;
                      *(uint *)(args.ray + 0x10c) =
                           ~auVar81._12_4_ & uVar129 | *(uint *)(args.ray + 0x10c) & auVar81._12_4_;
                      uVar29 = *(uint *)(args.hit + 0x54);
                      uVar8 = *(uint *)(args.hit + 0x58);
                      uVar129 = *(uint *)(args.hit + 0x5c);
                      *(uint *)(args.ray + 0x110) =
                           *(uint *)(args.ray + 0x110) & auVar81._0_4_ |
                           ~auVar81._0_4_ & *(uint *)(args.hit + 0x50);
                      *(uint *)(args.ray + 0x114) =
                           *(uint *)(args.ray + 0x114) & auVar81._4_4_ | ~auVar81._4_4_ & uVar29;
                      *(uint *)(args.ray + 0x118) =
                           *(uint *)(args.ray + 0x118) & auVar81._8_4_ | ~auVar81._8_4_ & uVar8;
                      *(uint *)(args.ray + 0x11c) =
                           *(uint *)(args.ray + 0x11c) & auVar81._12_4_ | ~auVar81._12_4_ & uVar129;
                      uVar29 = *(uint *)(args.hit + 100);
                      uVar8 = *(uint *)(args.hit + 0x68);
                      uVar129 = *(uint *)(args.hit + 0x6c);
                      *(uint *)(args.ray + 0x120) =
                           *(uint *)(args.ray + 0x120) & auVar81._0_4_ |
                           ~auVar81._0_4_ & *(uint *)(args.hit + 0x60);
                      *(uint *)(args.ray + 0x124) =
                           *(uint *)(args.ray + 0x124) & auVar81._4_4_ | ~auVar81._4_4_ & uVar29;
                      *(uint *)(args.ray + 0x128) =
                           *(uint *)(args.ray + 0x128) & auVar81._8_4_ | ~auVar81._8_4_ & uVar8;
                      *(uint *)(args.ray + 300) =
                           *(uint *)(args.ray + 300) & auVar81._12_4_ | ~auVar81._12_4_ & uVar129;
                      auVar127._0_4_ = *(uint *)(args.ray + 0x130) & auVar81._0_4_;
                      auVar127._4_4_ = *(uint *)(args.ray + 0x134) & auVar81._4_4_;
                      auVar127._8_4_ = *(uint *)(args.ray + 0x138) & auVar81._8_4_;
                      auVar127._12_4_ = *(uint *)(args.ray + 0x13c) & auVar81._12_4_;
                      auVar143._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x70);
                      auVar143._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x74);
                      auVar143._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x78);
                      auVar143._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x7c);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar143 | auVar127;
                      *(undefined1 (*) [16])(args.ray + 0x140) =
                           ~auVar81 & *(undefined1 (*) [16])(args.hit + 0x80) |
                           *(undefined1 (*) [16])(args.ray + 0x140) & auVar81;
                      pRVar36 = args.ray;
                    }
                  }
                  auVar102._0_4_ = auVar101._0_4_ << 0x1f;
                  auVar102._4_4_ = auVar101._4_4_ << 0x1f;
                  auVar102._8_4_ = auVar101._8_4_ << 0x1f;
                  auVar102._12_4_ = auVar101._12_4_ << 0x1f;
                  iVar38 = movmskps((int)pRVar36,auVar102);
                  if (iVar38 == 0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar156;
                  }
                  else {
                    fVar156 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_1418 + lVar34 * 4 + -0x10) = 0;
                  valid.field_0.i[0] = -(uint)(auVar120._0_4_ <= fVar156) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(auVar120._4_4_ <= fVar156) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(auVar120._8_4_ <= fVar156) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(auVar120._12_4_ <= fVar156) & valid.field_0.i[3];
                  iVar38 = movmskps(iVar38,(undefined1  [16])valid.field_0);
                  uVar41 = local_11c0;
                  uVar43 = local_11c8;
                  uVar45 = local_11d0;
                  uVar46 = local_11d8;
                  uVar47 = local_11e0;
                  fVar234 = local_1078;
                  fVar229 = fStack_1074;
                  fVar255 = fStack_1070;
                  fVar244 = fStack_106c;
                  auVar68 = local_1278;
                  fVar198 = local_1068;
                  fVar153 = fStack_1064;
                  fVar154 = fStack_1060;
                  fVar155 = fStack_105c;
                  fVar243 = local_1088;
                  fVar157 = fStack_1084;
                  fVar164 = fStack_1080;
                  fVar165 = fStack_107c;
                  fVar254 = local_1098;
                  fVar167 = fStack_1094;
                  fVar188 = fStack_1090;
                  fVar192 = fStack_108c;
                  if (iVar38 == 0) break;
                  auVar103._0_4_ = valid.field_0.i[0] & (uint)auVar120._0_4_;
                  auVar103._4_4_ = valid.field_0.i[1] & (uint)auVar120._4_4_;
                  auVar103._8_4_ = valid.field_0.i[2] & (uint)auVar120._8_4_;
                  auVar103._12_4_ = valid.field_0.i[3] & (uint)auVar120._12_4_;
                  auVar128._0_8_ =
                       CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                  auVar128._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                  auVar128._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                  auVar128 = auVar128 | auVar103;
                  auVar144._4_4_ = auVar128._0_4_;
                  auVar144._0_4_ = auVar128._4_4_;
                  auVar144._8_4_ = auVar128._12_4_;
                  auVar144._12_4_ = auVar128._8_4_;
                  auVar111 = minps(auVar144,auVar128);
                  auVar104._0_8_ = auVar111._8_8_;
                  auVar104._8_4_ = auVar111._0_4_;
                  auVar104._12_4_ = auVar111._4_4_;
                  auVar111 = minps(auVar104,auVar111);
                  auVar105._0_8_ =
                       CONCAT44(-(uint)(auVar111._4_4_ == auVar128._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar111._0_4_ == auVar128._0_4_) & valid.field_0.i[0]);
                  auVar105._8_4_ = -(uint)(auVar111._8_4_ == auVar128._8_4_) & valid.field_0.i[2];
                  auVar105._12_4_ = -(uint)(auVar111._12_4_ == auVar128._12_4_) & valid.field_0.i[3]
                  ;
                  iVar38 = movmskps(iVar38,auVar105);
                  aVar82 = valid.field_0;
                  if (iVar38 != 0) {
                    aVar82.i[2] = auVar105._8_4_;
                    aVar82._0_8_ = auVar105._0_8_;
                    aVar82.i[3] = auVar105._12_4_;
                  }
                  uVar31 = movmskps(iVar38,(undefined1  [16])aVar82);
                  uVar41 = CONCAT44((int)((ulong)pRVar36 >> 0x20),uVar31);
                  lVar34 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_11e8 = local_11e8 + 1;
  auVar111 = local_10a8;
  fVar156 = local_1198;
  fVar180 = fStack_1194;
  fVar168 = fStack_1190;
  fVar166 = fStack_118c;
  fVar187 = local_10b8;
  fVar176 = fStack_10b4;
  fVar230 = fStack_10b0;
  fVar178 = fStack_10ac;
  fVar106 = local_1188;
  fVar177 = fStack_1184;
  fVar247 = fStack_1180;
  fVar250 = fStack_117c;
  fVar179 = local_11a8;
  fVar252 = fStack_11a4;
  fVar185 = fStack_11a0;
  fVar186 = fStack_119c;
  goto LAB_00676108;
LAB_00677bf8:
  uVar30 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar30;
  auVar88._0_4_ = uVar30;
  auVar88._8_4_ = uVar30;
  auVar88._12_4_ = uVar30;
  goto LAB_00675d7c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }